

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O2

void run_schnorrsig_tests(void)

{
  undefined1 auVar1 [16];
  secp256k1_context *psVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  uchar *puVar7;
  long lVar8;
  byte bVar9;
  secp256k1_sha256 *sig64;
  size_t in_R8;
  char *pcVar10;
  byte *pbVar11;
  int iVar12;
  uint32_t *sig64_00;
  ulong uVar13;
  uchar **msg_00;
  undefined8 uVar14;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar nonce_z [32];
  uchar key [32];
  uchar *args [5];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_sha256 sha_optimized;
  secp256k1_xonly_pubkey local_1a8;
  secp256k1_sha256 sha;
  secp256k1_keypair local_a8;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  
  puVar7 = algo;
  builtin_memcpy(algo + 8,"nonce",5);
  builtin_memcpy(algo,"BIP0340/",8);
  secp256k1_sha256_initialize_tagged(&sha,"BIP0340/nonce",0xd);
  secp256k1_nonce_function_bip340_sha256_tagged(&sha_optimized);
  test_sha256_eq(&sha,&sha_optimized);
  secp256k1_sha256_initialize_tagged(&sha,"BIP0340/auxBIP0340/nonceBIP0340/challenge",0xb);
  secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha_optimized);
  test_sha256_eq(&sha,&sha_optimized);
  testrand256(msg);
  testrand256(key);
  testrand256(pk);
  testrand256(aux_rand);
  args[3] = algo;
  args[2] = pk;
  args[0] = msg;
  args[1] = key;
  args[4] = aux_rand;
  for (iVar12 = 0; iVar12 < COUNT; iVar12 = iVar12 + 1) {
    nonce_function_bip340_bitflip(args,0,0x20,(size_t)puVar7,in_R8);
    nonce_function_bip340_bitflip(args,1,0x20,(size_t)puVar7,in_R8);
    nonce_function_bip340_bitflip(args,2,0x20,(size_t)puVar7,in_R8);
    nonce_function_bip340_bitflip(args,3,0xd,(size_t)puVar7,in_R8);
    nonce_function_bip340_bitflip(args,3,0xd,(size_t)puVar7,in_R8);
    nonce_function_bip340_bitflip(args,4,0x20,(size_t)puVar7,in_R8);
  }
  iVar12 = nonce_function_bip340(nonce,msg,0x20,key,pk,algo,0xd,(void *)0x0);
  if (iVar12 == 0) {
    pcVar10 = 
    "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1"
    ;
    uVar14 = 0x4d;
  }
  else {
    testrand_bytes_test(algo,0xd);
    iVar12 = nonce_function_bip340(nonce,msg,0x20,key,pk,algo,0xd,(void *)0x0);
    if (iVar12 == 0) {
      pcVar10 = 
      "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1"
      ;
      uVar14 = 0x50;
    }
    else {
      for (iVar12 = 0; iVar12 < COUNT; iVar12 = iVar12 + 1) {
        uVar3 = testrand_int(0x1f);
        iVar4 = nonce_function_bip340(nonce_z,msg,(ulong)(uVar3 & 0x1f),key,pk,algo,0xd,(void *)0x0)
        ;
        if (iVar4 == 0) {
          pcVar10 = 
          "test condition failed: nonce_function_bip340(nonce2, msg, msglen_tmp, key, pk, algo, algolen, NULL) == 1"
          ;
          uVar14 = 0x59;
          goto LAB_00128441;
        }
        iVar4 = secp256k1_memcmp_var(nonce,nonce_z,0x20);
        if (iVar4 == 0) {
          pcVar10 = "test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0";
          uVar14 = 0x5a;
          goto LAB_00128441;
        }
        uVar3 = testrand_int(0xc);
        iVar4 = nonce_function_bip340
                          (nonce_z,msg,0x20,key,pk,algo,((ulong)uVar3 + 0xd) % 0xd,(void *)0x0);
        if (iVar4 == 0) {
          pcVar10 = 
          "test condition failed: nonce_function_bip340(nonce2, msg, msglen, key, pk, algo, algolen_tmp, NULL) == 1"
          ;
          uVar14 = 0x5f;
          goto LAB_00128441;
        }
        iVar4 = secp256k1_memcmp_var(nonce,nonce_z,0x20);
        if (iVar4 == 0) {
          pcVar10 = "test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0";
          uVar14 = 0x60;
          goto LAB_00128441;
        }
      }
      aux_rand[0x10] = '\0';
      aux_rand[0x11] = '\0';
      aux_rand[0x12] = '\0';
      aux_rand[0x13] = '\0';
      aux_rand[0x14] = '\0';
      aux_rand[0x15] = '\0';
      aux_rand[0x16] = '\0';
      aux_rand[0x17] = '\0';
      aux_rand[0x18] = '\0';
      aux_rand[0x19] = '\0';
      aux_rand[0x1a] = '\0';
      aux_rand[0x1b] = '\0';
      aux_rand[0x1c] = '\0';
      aux_rand[0x1d] = '\0';
      aux_rand[0x1e] = '\0';
      aux_rand[0x1f] = '\0';
      aux_rand[0] = '\0';
      aux_rand[1] = '\0';
      aux_rand[2] = '\0';
      aux_rand[3] = '\0';
      aux_rand[4] = '\0';
      aux_rand[5] = '\0';
      aux_rand[6] = '\0';
      aux_rand[7] = '\0';
      aux_rand[8] = '\0';
      aux_rand[9] = '\0';
      aux_rand[10] = '\0';
      aux_rand[0xb] = '\0';
      aux_rand[0xc] = '\0';
      aux_rand[0xd] = '\0';
      aux_rand[0xe] = '\0';
      aux_rand[0xf] = '\0';
      iVar12 = nonce_function_bip340(nonce_z,msg,0x20,key,pk,algo,0xd,aux_rand);
      if (iVar12 == 0) {
        pcVar10 = 
        "test condition failed: nonce_function_bip340(nonce_z, msg, msglen, key, pk, algo, algolen, &aux_rand) == 1"
        ;
        uVar14 = 0x65;
      }
      else {
        iVar12 = nonce_function_bip340(nonce,msg,0x20,key,pk,algo,0xd,(void *)0x0);
        if (iVar12 == 0) {
          pcVar10 = 
          "test condition failed: nonce_function_bip340(nonce, msg, msglen, key, pk, algo, algolen, NULL) == 1"
          ;
          uVar14 = 0x66;
        }
        else {
          iVar12 = secp256k1_memcmp_var(nonce_z,nonce,0x20);
          if (iVar12 == 0) {
            args[4] = (uchar *)0x0;
            args[2] = (uchar *)0x0;
            args[3] = (uchar *)0x0;
            args[0] = (uchar *)0x0;
            args[1] = (uchar *)0x0;
            algo[0] = 0xda;
            algo[1] = 'o';
            algo[2] = 0xb3;
            algo[3] = 0x8c;
            algo[4] = '\0';
            algo[5] = '\0';
            algo[6] = '\0';
            algo[7] = '\0';
            algo[8] = '\0';
            algo[9] = '\0';
            algo[10] = '\0';
            algo[0xb] = '\0';
            algo[0xc] = '\0';
            invalid_extraparams.magic[0] = '\0';
            invalid_extraparams.magic[1] = '\0';
            invalid_extraparams.magic[2] = '\0';
            invalid_extraparams.magic[3] = '\0';
            invalid_extraparams._4_4_ = 0;
            invalid_extraparams.noncefp = (secp256k1_nonce_function_hardened)0x0;
            invalid_extraparams.ndata = (void *)0x0;
            testrand256(msg);
            testrand256(key);
            testrand256(pk);
            testrand256(aux_rand);
            iVar12 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)&sha,msg);
            if (iVar12 == 0) {
              pcVar10 = 
              "test condition failed: secp256k1_keypair_create(CTX, &keypairs[0], sk1) == 1";
              uVar14 = 0x7b;
            }
            else {
              iVar12 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)&sha.bytes,key);
              if (iVar12 == 0) {
                pcVar10 = 
                "test condition failed: secp256k1_keypair_create(CTX, &keypairs[1], sk2) == 1";
                uVar14 = 0x7c;
              }
              else {
                iVar12 = secp256k1_keypair_create(CTX,&local_a8,pk);
                if (iVar12 == 0) {
                  pcVar10 = 
                  "test condition failed: secp256k1_keypair_create(CTX, &keypairs[2], sk3) == 1";
                  uVar14 = 0x7d;
                }
                else {
                  iVar12 = secp256k1_keypair_xonly_pub
                                     (CTX,(secp256k1_xonly_pubkey *)&sha_optimized,(int *)0x0,
                                      (secp256k1_keypair *)&sha);
                  if (iVar12 == 0) {
                    pcVar10 = 
                    "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk[0], NULL, &keypairs[0]) == 1"
                    ;
                    uVar14 = 0x7e;
                  }
                  else {
                    iVar12 = secp256k1_keypair_xonly_pub
                                       (CTX,(secp256k1_xonly_pubkey *)(sha_optimized.buf + 0x20),
                                        (int *)0x0,(secp256k1_keypair *)&sha.bytes);
                    if (iVar12 == 0) {
                      pcVar10 = 
                      "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk[1], NULL, &keypairs[1]) == 1"
                      ;
                      uVar14 = 0x7f;
                    }
                    else {
                      iVar12 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,&local_a8);
                      if (iVar12 == 0) {
                        pcVar10 = 
                        "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk[2], NULL, &keypairs[2]) == 1"
                        ;
                        uVar14 = 0x80;
                      }
                      else {
                        nonce[0x10] = '\0';
                        nonce[0x11] = '\0';
                        nonce[0x12] = '\0';
                        nonce[0x13] = '\0';
                        nonce[0x14] = '\0';
                        nonce[0x15] = '\0';
                        nonce[0x16] = '\0';
                        nonce[0x17] = '\0';
                        nonce[0x18] = '\0';
                        nonce[0x19] = '\0';
                        nonce[0x1a] = '\0';
                        nonce[0x1b] = '\0';
                        nonce[0x1c] = '\0';
                        nonce[0x1d] = '\0';
                        nonce[0x1e] = '\0';
                        nonce[0x1f] = '\0';
                        nonce[0] = '\0';
                        nonce[1] = '\0';
                        nonce[2] = '\0';
                        nonce[3] = '\0';
                        nonce[4] = '\0';
                        nonce[5] = '\0';
                        nonce[6] = '\0';
                        nonce[7] = '\0';
                        nonce[8] = '\0';
                        nonce[9] = '\0';
                        nonce[10] = '\0';
                        nonce[0xb] = '\0';
                        nonce[0xc] = '\0';
                        nonce[0xd] = '\0';
                        nonce[0xe] = '\0';
                        nonce[0xf] = '\0';
                        iVar12 = secp256k1_schnorrsig_sign32
                                           (CTX,nonce_z,aux_rand,(secp256k1_keypair *)&sha,
                                            (uchar *)0x0);
                        if (iVar12 == 0) {
                          pcVar10 = 
                          "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypairs[0], NULL) == 1"
                          ;
                          uVar14 = 0x84;
                        }
                        else {
                          _calls_to_callback = 0;
                          _saved_callback.fn = (CTX->illegal_callback).fn;
                          _saved_callback.data = (CTX->illegal_callback).data;
                          secp256k1_context_set_illegal_callback
                                    (CTX,counting_callback_fn,&_calls_to_callback);
                          iVar12 = secp256k1_schnorrsig_sign32
                                             (CTX,(uchar *)0x0,aux_rand,(secp256k1_keypair *)&sha,
                                              (uchar *)0x0);
                          psVar2 = CTX;
                          if (iVar12 == 0) {
                            (CTX->illegal_callback).fn = _saved_callback.fn;
                            (psVar2->illegal_callback).data = _saved_callback.data;
                            if (_calls_to_callback == 1) {
                              _calls_to_callback = 0;
                              _saved_callback.fn = (psVar2->illegal_callback).fn;
                              _saved_callback.data = (psVar2->illegal_callback).data;
                              secp256k1_context_set_illegal_callback
                                        (psVar2,counting_callback_fn,&_calls_to_callback);
                              iVar12 = secp256k1_schnorrsig_sign32
                                                 (CTX,nonce_z,(uchar *)0x0,(secp256k1_keypair *)&sha
                                                  ,(uchar *)0x0);
                              psVar2 = CTX;
                              if (iVar12 == 0) {
                                (CTX->illegal_callback).fn = _saved_callback.fn;
                                (psVar2->illegal_callback).data = _saved_callback.data;
                                if (_calls_to_callback == 1) {
                                  _calls_to_callback = 0;
                                  _saved_callback.fn = (psVar2->illegal_callback).fn;
                                  _saved_callback.data = (psVar2->illegal_callback).data;
                                  secp256k1_context_set_illegal_callback
                                            (psVar2,counting_callback_fn,&_calls_to_callback);
                                  iVar12 = secp256k1_schnorrsig_sign32
                                                     (CTX,nonce_z,aux_rand,(secp256k1_keypair *)0x0,
                                                      (uchar *)0x0);
                                  psVar2 = CTX;
                                  if (iVar12 == 0) {
                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                    (psVar2->illegal_callback).data = _saved_callback.data;
                                    if (_calls_to_callback == 1) {
                                      _calls_to_callback = 0;
                                      _saved_callback.fn = (psVar2->illegal_callback).fn;
                                      _saved_callback.data = (psVar2->illegal_callback).data;
                                      secp256k1_context_set_illegal_callback
                                                (psVar2,counting_callback_fn,&_calls_to_callback);
                                      iVar12 = secp256k1_schnorrsig_sign32
                                                         (CTX,nonce_z,aux_rand,
                                                          (secp256k1_keypair *)args,(uchar *)0x0);
                                      psVar2 = CTX;
                                      if (iVar12 == 0) {
                                        (CTX->illegal_callback).fn = _saved_callback.fn;
                                        (psVar2->illegal_callback).data = _saved_callback.data;
                                        if (_calls_to_callback == 1) {
                                          _calls_to_callback = 0;
                                          _saved_callback.fn = (STATIC_CTX->illegal_callback).fn;
                                          _saved_callback.data = (STATIC_CTX->illegal_callback).data
                                          ;
                                          secp256k1_context_set_illegal_callback
                                                    (STATIC_CTX,counting_callback_fn,
                                                     &_calls_to_callback);
                                          iVar12 = secp256k1_schnorrsig_sign32
                                                             (STATIC_CTX,nonce_z,aux_rand,
                                                              (secp256k1_keypair *)&sha,(uchar *)0x0
                                                             );
                                          psVar2 = STATIC_CTX;
                                          if (iVar12 == 0) {
                                            (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
                                            (psVar2->illegal_callback).data = _saved_callback.data;
                                            if (_calls_to_callback == 1) {
                                              iVar12 = secp256k1_schnorrsig_sign_custom
                                                                 (CTX,nonce_z,aux_rand,0x20,
                                                                  (secp256k1_keypair *)&sha,
                                                                  (secp256k1_schnorrsig_extraparams
                                                                   *)algo);
                                              if (iVar12 == 0) {
                                                pcVar10 = 
                                                "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypairs[0], &extraparams) == 1"
                                                ;
                                                uVar14 = 0x8b;
                                                goto LAB_00128441;
                                              }
                                              _calls_to_callback = 0;
                                              _saved_callback.fn = (CTX->illegal_callback).fn;
                                              _saved_callback.data = (CTX->illegal_callback).data;
                                              secp256k1_context_set_illegal_callback
                                                        (CTX,counting_callback_fn,
                                                         &_calls_to_callback);
                                              iVar12 = secp256k1_schnorrsig_sign_custom
                                                                 (CTX,(uchar *)0x0,aux_rand,0x20,
                                                                  (secp256k1_keypair *)&sha,
                                                                  (secp256k1_schnorrsig_extraparams
                                                                   *)algo);
                                              psVar2 = CTX;
                                              if (iVar12 == 0) {
                                                (CTX->illegal_callback).fn = _saved_callback.fn;
                                                (psVar2->illegal_callback).data =
                                                     _saved_callback.data;
                                                if (_calls_to_callback == 1) {
                                                  _calls_to_callback = 0;
                                                  _saved_callback.fn = (psVar2->illegal_callback).fn
                                                  ;
                                                  _saved_callback.data =
                                                       (psVar2->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (psVar2,counting_callback_fn,
                                                             &_calls_to_callback);
                                                  iVar12 = secp256k1_schnorrsig_sign_custom
                                                                     (CTX,nonce_z,(uchar *)0x0,0x20,
                                                                      (secp256k1_keypair *)&sha,
                                                                      (
                                                  secp256k1_schnorrsig_extraparams *)algo);
                                                  psVar2 = CTX;
                                                  if (iVar12 == 0) {
                                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      iVar12 = secp256k1_schnorrsig_sign_custom
                                                                         (psVar2,nonce_z,
                                                                          (uchar *)0x0,0,
                                                                          (secp256k1_keypair *)&sha,
                                                                          (
                                                  secp256k1_schnorrsig_extraparams *)algo);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, NULL, 0, &keypairs[0], &extraparams) == 1"
                                                  ;
                                                  uVar14 = 0x8e;
                                                  goto LAB_00128441;
                                                  }
                                                  _calls_to_callback = 0;
                                                  _saved_callback.fn = (CTX->illegal_callback).fn;
                                                  _saved_callback.data =
                                                       (CTX->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,
                                                             &_calls_to_callback);
                                                  iVar12 = secp256k1_schnorrsig_sign_custom
                                                                     (CTX,nonce_z,aux_rand,0x20,
                                                                      (secp256k1_keypair *)0x0,
                                                                      (
                                                  secp256k1_schnorrsig_extraparams *)algo);
                                                  psVar2 = CTX;
                                                  if (iVar12 == 0) {
                                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      _calls_to_callback = 0;
                                                      _saved_callback.fn =
                                                           (psVar2->illegal_callback).fn;
                                                      _saved_callback.data =
                                                           (psVar2->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar2,counting_callback_fn,
                                                                 &_calls_to_callback);
                                                      iVar12 = secp256k1_schnorrsig_sign_custom
                                                                         (CTX,nonce_z,aux_rand,0x20,
                                                                          (secp256k1_keypair *)args,
                                                                          (
                                                  secp256k1_schnorrsig_extraparams *)algo);
                                                  psVar2 = CTX;
                                                  if (iVar12 == 0) {
                                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      iVar12 = secp256k1_schnorrsig_sign_custom
                                                                         (psVar2,nonce_z,aux_rand,
                                                                          0x20,(secp256k1_keypair *)
                                                                               &sha,
                                                                          (
                                                  secp256k1_schnorrsig_extraparams *)0x0);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypairs[0], NULL) == 1"
                                                  ;
                                                  uVar14 = 0x91;
                                                  goto LAB_00128441;
                                                  }
                                                  _calls_to_callback = 0;
                                                  _saved_callback.fn = (CTX->illegal_callback).fn;
                                                  _saved_callback.data =
                                                       (CTX->illegal_callback).data;
                                                  secp256k1_context_set_illegal_callback
                                                            (CTX,counting_callback_fn,
                                                             &_calls_to_callback);
                                                  iVar12 = secp256k1_schnorrsig_sign_custom
                                                                     (CTX,nonce_z,aux_rand,0x20,
                                                                      (secp256k1_keypair *)&sha,
                                                                      &invalid_extraparams);
                                                  psVar2 = CTX;
                                                  if (iVar12 == 0) {
                                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      _calls_to_callback = 0;
                                                      _saved_callback.fn =
                                                           (STATIC_CTX->illegal_callback).fn;
                                                      _saved_callback.data =
                                                           (STATIC_CTX->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (STATIC_CTX,counting_callback_fn,
                                                                 &_calls_to_callback);
                                                      iVar12 = secp256k1_schnorrsig_sign_custom
                                                                         (STATIC_CTX,nonce_z,
                                                                          aux_rand,0x20,
                                                                          (secp256k1_keypair *)&sha,
                                                                          (
                                                  secp256k1_schnorrsig_extraparams *)algo);
                                                  psVar2 = STATIC_CTX;
                                                  if (iVar12 == 0) {
                                                    (STATIC_CTX->illegal_callback).fn =
                                                         _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      iVar12 = secp256k1_schnorrsig_sign32
                                                                         (CTX,nonce_z,aux_rand,
                                                                          (secp256k1_keypair *)&sha,
                                                                          (uchar *)0x0);
                                                      if (iVar12 == 0) {
                                                        pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypairs[0], NULL) == 1"
                                                  ;
                                                  uVar14 = 0x95;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_schnorrsig_verify
                                                                       (CTX,nonce_z,aux_rand,0x20,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &sha_optimized);
                                                    if (iVar12 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk[0]) == 1"
                                                  ;
                                                  uVar14 = 0x96;
                                                  }
                                                  else {
                                                    _calls_to_callback = 0;
                                                    _saved_callback.fn = (CTX->illegal_callback).fn;
                                                    _saved_callback.data =
                                                         (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback);
                                                    iVar12 = secp256k1_schnorrsig_verify
                                                                       (CTX,(uchar *)0x0,aux_rand,
                                                                        0x20,(secp256k1_xonly_pubkey
                                                                              *)&sha_optimized);
                                                    psVar2 = CTX;
                                                    if (iVar12 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           _saved_callback.fn;
                                                      (psVar2->illegal_callback).data =
                                                           _saved_callback.data;
                                                      if (_calls_to_callback == 1) {
                                                        _calls_to_callback = 0;
                                                        _saved_callback.fn =
                                                             (psVar2->illegal_callback).fn;
                                                        _saved_callback.data =
                                                             (psVar2->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar2,counting_callback_fn,
                                                                   &_calls_to_callback);
                                                        iVar12 = secp256k1_schnorrsig_verify
                                                                           (CTX,nonce_z,(uchar *)0x0
                                                                            ,0x20,(
                                                  secp256k1_xonly_pubkey *)&sha_optimized);
                                                  psVar2 = CTX;
                                                  if (iVar12 == 0) {
                                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      iVar12 = secp256k1_schnorrsig_verify
                                                                         (psVar2,nonce_z,
                                                                          (uchar *)0x0,0,
                                                                          (secp256k1_xonly_pubkey *)
                                                                          &sha_optimized);
                                                      if (iVar12 == 0) {
                                                        _calls_to_callback = 0;
                                                        _saved_callback.fn =
                                                             (CTX->illegal_callback).fn;
                                                        _saved_callback.data =
                                                             (CTX->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (CTX,counting_callback_fn,
                                                                   &_calls_to_callback);
                                                        iVar12 = secp256k1_schnorrsig_verify
                                                                           (CTX,nonce_z,aux_rand,
                                                                            0x20,(
                                                  secp256k1_xonly_pubkey *)0x0);
                                                  psVar2 = CTX;
                                                  if (iVar12 == 0) {
                                                    (CTX->illegal_callback).fn = _saved_callback.fn;
                                                    (psVar2->illegal_callback).data =
                                                         _saved_callback.data;
                                                    if (_calls_to_callback == 1) {
                                                      _calls_to_callback = 0;
                                                      _saved_callback.fn =
                                                           (psVar2->illegal_callback).fn;
                                                      _saved_callback.data =
                                                           (psVar2->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar2,counting_callback_fn,
                                                                 &_calls_to_callback);
                                                      iVar12 = secp256k1_schnorrsig_verify
                                                                         (CTX,nonce_z,aux_rand,0x20,
                                                                          (secp256k1_xonly_pubkey *)
                                                                          nonce);
                                                      psVar2 = CTX;
                                                      if (iVar12 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             _saved_callback.fn;
                                                        (psVar2->illegal_callback).data =
                                                             _saved_callback.data;
                                                        if (_calls_to_callback == 1) {
                                                          secp256k1_sha256_initialize_tagged
                                                                    (&sha,(uchar *)
                                                  "BIP0340/challenge",0x11);
                                                  secp256k1_schnorrsig_sha256_tagged(&sha_optimized)
                                                  ;
                                                  test_sha256_eq(&sha,&sha_optimized);
                                                  sha_optimized.s[4] = 0;
                                                  sha_optimized.s[5] = 0;
                                                  sha_optimized.s[6] = 0;
                                                  sha_optimized.s[7] = 0x3000000;
                                                  sha_optimized.s[0] = 0;
                                                  sha_optimized.s[1] = 0;
                                                  sha_optimized.s[2] = 0;
                                                  sha_optimized.s[3] = 0;
                                                  args[2] = (uchar *)0xb0996f8345c831b5;
                                                  args[3] = (uchar *)0xf936e0bc13f10186;
                                                  args[0] = (uchar *)0x10c35892018a30f9;
                                                  args[1] = (uchar *)0x29529df8854f3449;
                                                  nonce._16_16_ = ZEXT816(0);
                                                  nonce._0_16_ = ZEXT816(0);
                                                  nonce_z[0x10] = '\0';
                                                  nonce_z[0x11] = '\0';
                                                  nonce_z[0x12] = '\0';
                                                  nonce_z[0x13] = '\0';
                                                  nonce_z[0x14] = '\0';
                                                  nonce_z[0x15] = '\0';
                                                  nonce_z[0x16] = '\0';
                                                  nonce_z[0x17] = '\0';
                                                  nonce_z[0x18] = '\0';
                                                  nonce_z[0x19] = '\0';
                                                  nonce_z[0x1a] = '\0';
                                                  nonce_z[0x1b] = '\0';
                                                  nonce_z[0x1c] = '\0';
                                                  nonce_z[0x1d] = '\0';
                                                  nonce_z[0x1e] = '\0';
                                                  nonce_z[0x1f] = '\0';
                                                  nonce_z[0] = '\0';
                                                  nonce_z[1] = '\0';
                                                  nonce_z[2] = '\0';
                                                  nonce_z[3] = '\0';
                                                  nonce_z[4] = '\0';
                                                  nonce_z[5] = '\0';
                                                  nonce_z[6] = '\0';
                                                  nonce_z[7] = '\0';
                                                  nonce_z[8] = '\0';
                                                  nonce_z[9] = '\0';
                                                  nonce_z[10] = '\0';
                                                  nonce_z[0xb] = '\0';
                                                  nonce_z[0xc] = '\0';
                                                  nonce_z[0xd] = '\0';
                                                  nonce_z[0xe] = '\0';
                                                  nonce_z[0xf] = '\0';
                                                  sha.buf[0x10] = 0xeb;
                                                  sha.buf[0x11] = 0xee;
                                                  sha.buf[0x12] = 0xe8;
                                                  sha.buf[0x13] = 0xfd;
                                                  sha.buf[0x14] = 0xb2;
                                                  sha.buf[0x15] = '\x17';
                                                  sha.buf[0x16] = '/';
                                                  sha.buf[0x17] = 'G';
                                                  sha.buf[0x18] = '}';
                                                  sha.buf[0x19] = 0xf4;
                                                  sha.buf[0x1a] = 0x90;
                                                  sha.buf[0x1b] = '\r';
                                                  sha.buf[0x1c] = '1';
                                                  sha.buf[0x1d] = '\x05';
                                                  sha.buf[0x1e] = '6';
                                                  sha.buf[0x1f] = 0xc0;
                                                  sha.buf[0] = '%';
                                                  sha.buf[1] = 0xf6;
                                                  sha.buf[2] = 'j';
                                                  sha.buf[3] = 'J';
                                                  sha.buf[4] = 0x85;
                                                  sha.buf[5] = 0xea;
                                                  sha.buf[6] = 0x8b;
                                                  sha.buf[7] = 'q';
                                                  sha.buf[8] = 0xe4;
                                                  sha.buf[9] = 0x82;
                                                  sha.buf[10] = 0xa7;
                                                  sha.buf[0xb] = 'O';
                                                  sha.buf[0xc] = '8';
                                                  sha.buf[0xd] = '-';
                                                  sha.buf[0xe] = ',';
                                                  sha.buf[0xf] = 0xe5;
                                                  sha.s[4] = 0x5f1cdf4b;
                                                  sha.s[5] = 0x8b00783;
                                                  sha.s[6] = 0xcef1554c;
                                                  sha.s[7] = 0x1582ca2d;
                                                  sha.s[0] = 0x1f8307e9;
                                                  sha.s[1] = 0x108d8480;
                                                  sha.s[2] = 0x1b37a569;
                                                  sha.s[3] = 0x36102440;
                                                  test_schnorrsig_bip_vectors_check_signing
                                                            ((uchar *)&sha_optimized,(uchar *)args,
                                                             nonce,nonce_z,0x20,(uchar *)&sha);
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            ((uchar *)args,nonce_z,0x20,
                                                             (uchar *)&sha,1);
                                                  sha_optimized.s[4] = 0xf16e762;
                                                  sha_optimized.s[5] = 0x56dab438;
                                                  sha_optimized.s[6] = 0x4d984a7;
                                                  sha_optimized.s[7] = 0xefcf9051;
                                                  sha_optimized.s[0] = 0x6251e1b7;
                                                  sha_optimized.s[1] = 0x6a2aed8a;
                                                  sha_optimized.s[2] = 0x805871bf;
                                                  sha_optimized.s[3] = 0xc7f3f49c;
                                                  args[2] = (uchar *)0xd8cedea21daefe58;
                                                  args[3] = (uchar *)0x59a62b507b0f2443;
                                                  args[0] = (uchar *)0x5f1c672a7fd7f1df;
                                                  args[1] = (uchar *)0xbe4123db26371836;
                                                  nonce[0x10] = '\0';
                                                  nonce[0x11] = '\0';
                                                  nonce[0x12] = '\0';
                                                  nonce[0x13] = '\0';
                                                  nonce[0x14] = '\0';
                                                  nonce[0x15] = '\0';
                                                  nonce[0x16] = '\0';
                                                  nonce[0x17] = '\0';
                                                  nonce[0x18] = '\0';
                                                  nonce[0x19] = '\0';
                                                  nonce[0x1a] = '\0';
                                                  nonce[0x1b] = '\0';
                                                  nonce[0x1c] = '\0';
                                                  nonce[0x1d] = '\0';
                                                  nonce[0x1e] = '\0';
                                                  nonce[0x1f] = '\x01';
                                                  nonce._0_16_ = ZEXT816(0);
                                                  nonce_z[0x10] = 0xa4;
                                                  nonce_z[0x11] = '\t';
                                                  nonce_z[0x12] = '8';
                                                  nonce_z[0x13] = '\"';
                                                  nonce_z[0x14] = ')';
                                                  nonce_z[0x15] = 0x9f;
                                                  nonce_z[0x16] = '1';
                                                  nonce_z[0x17] = 0xd0;
                                                  nonce_z[0x18] = '\b';
                                                  nonce_z[0x19] = '.';
                                                  nonce_z[0x1a] = 0xfa;
                                                  nonce_z[0x1b] = 0x98;
                                                  nonce_z[0x1c] = 0xec;
                                                  nonce_z[0x1d] = 'N';
                                                  nonce_z[0x1e] = 'l';
                                                  nonce_z[0x1f] = 0x89;
                                                  nonce_z[0] = '$';
                                                  nonce_z[1] = '?';
                                                  nonce_z[2] = 'j';
                                                  nonce_z[3] = 0x88;
                                                  nonce_z[4] = 0x85;
                                                  nonce_z[5] = 0xa3;
                                                  nonce_z[6] = '\b';
                                                  nonce_z[7] = 0xd3;
                                                  nonce_z[8] = '\x13';
                                                  nonce_z[9] = '\x19';
                                                  nonce_z[10] = 0x8a;
                                                  nonce_z[0xb] = '.';
                                                  nonce_z[0xc] = '\x03';
                                                  nonce_z[0xd] = 'p';
                                                  nonce_z[0xe] = 's';
                                                  nonce_z[0xf] = 'D';
                                                  sha.buf[0x10] = 0x89;
                                                  sha.buf[0x11] = '~';
                                                  sha.buf[0x12] = 0xfc;
                                                  sha.buf[0x13] = 0xb6;
                                                  sha.buf[0x14] = '9';
                                                  sha.buf[0x15] = 0xea;
                                                  sha.buf[0x16] = 0x87;
                                                  sha.buf[0x17] = '\x1c';
                                                  sha.buf[0x18] = 0xfa;
                                                  sha.buf[0x19] = 0x95;
                                                  sha.buf[0x1a] = 0xf6;
                                                  sha.buf[0x1b] = 0xde;
                                                  sha.buf[0x1c] = '3';
                                                  sha.buf[0x1d] = 0x9e;
                                                  sha.buf[0x1e] = 'K';
                                                  sha.buf[0x1f] = '\n';
                                                  sha.buf[0] = 0x89;
                                                  sha.buf[1] = '\x06';
                                                  sha.buf[2] = 0xd1;
                                                  sha.buf[3] = '\x1a';
                                                  sha.buf[4] = 0xc9;
                                                  sha.buf[5] = 'v';
                                                  sha.buf[6] = 0xab;
                                                  sha.buf[7] = 0xcc;
                                                  sha.buf[8] = 0xb2;
                                                  sha.buf[9] = '\v';
                                                  sha.buf[10] = '\t';
                                                  sha.buf[0xb] = '\x12';
                                                  sha.buf[0xc] = 0x92;
                                                  sha.buf[0xd] = 0xbf;
                                                  sha.buf[0xe] = 0xf4;
                                                  sha.buf[0xf] = 0xea;
                                                  sha.s[4] = 0x3e41de1b;
                                                  sha.s[5] = 0x17f9436d;
                                                  sha.s[6] = 0x8ccf8ddc;
                                                  sha.s[7] = 0x4133de78;
                                                  sha.s[0] = 0x60bd9668;
                                                  sha.s[1] = 0x6d29aeee;
                                                  sha.s[2] = 0x9f228ab4;
                                                  sha.s[3] = 0x7fe1df7;
                                                  test_schnorrsig_bip_vectors_check_signing
                                                            ((uchar *)&sha_optimized,(uchar *)args,
                                                             nonce,nonce_z,0x20,(uchar *)&sha);
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            ((uchar *)args,nonce_z,0x20,
                                                             (uchar *)&sha,1);
                                                  sha_optimized.s[4] = 0x84e0229;
                                                  sha_optimized.s[5] = 0x74cc678a;
                                                  sha_optimized.s[6] = 0xa6be0b02;
                                                  sha_optimized.s[7] = 0xc9e5143b;
                                                  sha_optimized.s[0] = 0xa2da0fc9;
                                                  sha_optimized.s[1] = 0x34c26821;
                                                  sha_optimized.s[2] = 0x8b62c6c4;
                                                  sha_optimized.s[3] = 0xd11cdc80;
                                                  args[2] = (uchar *)0xc986b00953713901;
                                                  args[3] = (uchar *)0xb84e7769d98fe160;
                                                  args[0] = (uchar *)0x137e77c5fe8a30dd;
                                                  args[1] = (uchar *)0xccb7c19c2ba71f12;
                                                  nonce[0x18] = 'K';
                                                  nonce[0x19] = '\v';
                                                  nonce[0x1a] = 'b';
                                                  nonce[0x1b] = 0xd7;
                                                  nonce[0x1c] = 0x98;
                                                  nonce[0x1d] = 0xe6;
                                                  nonce[0x1e] = 0xd9;
                                                  nonce[0x1f] = '\x06';
                                                  nonce[0x10] = '\b';
                                                  nonce[0x11] = '\x0e';
                                                  nonce[0x12] = 'v';
                                                  nonce[0x13] = 0xcd;
                                                  nonce[0x14] = 0xc6;
                                                  nonce[0x15] = 0xd1;
                                                  nonce[0x16] = 'i';
                                                  nonce[0x17] = ',';
                                                  nonce[8] = '.';
                                                  nonce[9] = 0xb0;
                                                  nonce[10] = '5';
                                                  nonce[0xb] = 0xa2;
                                                  nonce[0xc] = 0xb5;
                                                  nonce[0xd] = 0xbb;
                                                  nonce[0xe] = 0xbc;
                                                  nonce[0xf] = 0xcc;
                                                  nonce[0] = 200;
                                                  nonce[1] = 'z';
                                                  nonce[2] = 0xa5;
                                                  nonce[3] = '8';
                                                  nonce[4] = '$';
                                                  nonce[5] = 0xb4;
                                                  nonce[6] = 0xd7;
                                                  nonce[7] = 0xae;
                                                  nonce_z[0x10] = 0xda;
                                                  nonce_z[0x11] = 0x98;
                                                  nonce_z[0x12] = '\x05';
                                                  nonce_z[0x13] = 0xaa;
                                                  nonce_z[0x14] = 0xb5;
                                                  nonce_z[0x15] = 'l';
                                                  nonce_z[0x16] = 'w';
                                                  nonce_z[0x17] = '3';
                                                  nonce_z[0x18] = '0';
                                                  nonce_z[0x19] = '$';
                                                  nonce_z[0x1a] = 0xb9;
                                                  nonce_z[0x1b] = 0xd0;
                                                  nonce_z[0x1c] = 0xa5;
                                                  nonce_z[0x1d] = '\b';
                                                  nonce_z[0x1e] = 0xb7;
                                                  nonce_z[0x1f] = '\\';
                                                  nonce_z[0] = '~';
                                                  nonce_z[1] = '-';
                                                  nonce_z[2] = 'X';
                                                  nonce_z[3] = 0xd8;
                                                  nonce_z[4] = 0xb3;
                                                  nonce_z[5] = 0xbc;
                                                  nonce_z[6] = 0xdf;
                                                  nonce_z[7] = '\x1a';
                                                  nonce_z[8] = 0xba;
                                                  nonce_z[9] = 0xde;
                                                  nonce_z[10] = 199;
                                                  nonce_z[0xb] = 0x82;
                                                  nonce_z[0xc] = 0x90;
                                                  nonce_z[0xd] = 'T';
                                                  nonce_z[0xe] = 0xf9;
                                                  nonce_z[0xf] = '\r';
                                                  sha.buf[0x10] = 'z';
                                                  sha.buf[0x11] = 0xde;
                                                  sha.buf[0x12] = 0xa9;
                                                  sha.buf[0x13] = 0x8d;
                                                  sha.buf[0x14] = 0x82;
                                                  sha.buf[0x15] = 0xf8;
                                                  sha.buf[0x16] = 'H';
                                                  sha.buf[0x17] = '\x1e';
                                                  sha.buf[0x18] = '\x0e';
                                                  sha.buf[0x19] = '\x1e';
                                                  sha.buf[0x1a] = '\x03';
                                                  sha.buf[0x1b] = 'g';
                                                  sha.buf[0x1c] = 'J';
                                                  sha.buf[0x1d] = 'o';
                                                  sha.buf[0x1e] = '?';
                                                  sha.buf[0x1f] = 0xb7;
                                                  sha.buf[0] = 0xab;
                                                  sha.buf[1] = 't';
                                                  sha.buf[2] = 'X';
                                                  sha.buf[3] = 'y';
                                                  sha.buf[4] = 0xa5;
                                                  sha.buf[5] = 0xad;
                                                  sha.buf[6] = 0x95;
                                                  sha.buf[7] = 'J';
                                                  sha.buf[8] = 'r';
                                                  sha.buf[9] = 0xc4;
                                                  sha.buf[10] = 'Z';
                                                  sha.buf[0xb] = 0x91;
                                                  sha.buf[0xc] = 0xc3;
                                                  sha.buf[0xd] = 0xa5;
                                                  sha.buf[0xe] = '\x1d';
                                                  sha.buf[0xf] = '<';
                                                  sha.s[4] = 0x2acf9bc4;
                                                  sha.s[5] = 0x8b8d7260;
                                                  sha.s[6] = 0x500f204c;
                                                  sha.s[7] = 0x1b3c31dd;
                                                  sha.s[0] = 0xeeaa3158;
                                                  sha.s[1] = 0xb74bb4d7;
                                                  sha.s[2] = 0x94ab5e4e;
                                                  sha.s[3] = 0x94429dba;
                                                  test_schnorrsig_bip_vectors_check_signing
                                                            ((uchar *)&sha_optimized,(uchar *)args,
                                                             nonce,nonce_z,0x20,(uchar *)&sha);
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            ((uchar *)args,nonce_z,0x20,
                                                             (uchar *)&sha,1);
                                                  sha_optimized.s[4] = 0x62307712;
                                                  sha_optimized.s[5] = 0x54a23fcf;
                                                  sha_optimized.s[6] = 0x8ef5449e;
                                                  sha_optimized.s[7] = 0x101740d2;
                                                  sha_optimized.s[0] = 0x262b430b;
                                                  sha_optimized.s[1] = 0x81739377;
                                                  sha_optimized.s[2] = 0xb05bf0ae;
                                                  sha_optimized.s[3] = 0xd0ec662a;
                                                  args[2] = (uchar *)0x8a461df2fb950d3a;
                                                  args[3] = (uchar *)0x17f5d860c1f8331b;
                                                  args[0] = (uchar *)0x25f50551f9dfd125;
                                                  args[1] = (uchar *)0xad96a928f622403c;
                                                  nonce[0x18] = 0xff;
                                                  nonce[0x19] = 0xff;
                                                  nonce[0x1a] = 0xff;
                                                  nonce[0x1b] = 0xff;
                                                  nonce[0x10] = 0xff;
                                                  nonce[0x11] = 0xff;
                                                  nonce[0x12] = 0xff;
                                                  nonce[0x13] = 0xff;
                                                  nonce[0x14] = 0xff;
                                                  nonce[0x15] = 0xff;
                                                  nonce[0x16] = 0xff;
                                                  nonce[0x17] = 0xff;
                                                  nonce[0x1c] = 0xff;
                                                  nonce[0x1d] = 0xff;
                                                  nonce[0x1e] = 0xff;
                                                  nonce[0x1f] = 0xff;
                                                  nonce[8] = 0xff;
                                                  nonce[9] = 0xff;
                                                  nonce[10] = 0xff;
                                                  nonce[0xb] = 0xff;
                                                  nonce[0] = 0xff;
                                                  nonce[1] = 0xff;
                                                  nonce[2] = 0xff;
                                                  nonce[3] = 0xff;
                                                  nonce[4] = 0xff;
                                                  nonce[5] = 0xff;
                                                  nonce[6] = 0xff;
                                                  nonce[7] = 0xff;
                                                  nonce[0xc] = 0xff;
                                                  nonce[0xd] = 0xff;
                                                  nonce[0xe] = 0xff;
                                                  nonce[0xf] = 0xff;
                                                  nonce_z[0x10] = 0xff;
                                                  nonce_z[0x11] = 0xff;
                                                  nonce_z[0x12] = 0xff;
                                                  nonce_z[0x13] = 0xff;
                                                  nonce_z[0x14] = 0xff;
                                                  nonce_z[0x15] = 0xff;
                                                  nonce_z[0x16] = 0xff;
                                                  nonce_z[0x17] = 0xff;
                                                  nonce_z[0x18] = 0xff;
                                                  nonce_z[0x19] = 0xff;
                                                  nonce_z[0x1a] = 0xff;
                                                  nonce_z[0x1b] = 0xff;
                                                  nonce_z[0x1c] = 0xff;
                                                  nonce_z[0x1d] = 0xff;
                                                  nonce_z[0x1e] = 0xff;
                                                  nonce_z[0x1f] = 0xff;
                                                  nonce_z[0] = 0xff;
                                                  nonce_z[1] = 0xff;
                                                  nonce_z[2] = 0xff;
                                                  nonce_z[3] = 0xff;
                                                  nonce_z[4] = 0xff;
                                                  nonce_z[5] = 0xff;
                                                  nonce_z[6] = 0xff;
                                                  nonce_z[7] = 0xff;
                                                  nonce_z[8] = 0xff;
                                                  nonce_z[9] = 0xff;
                                                  nonce_z[10] = 0xff;
                                                  nonce_z[0xb] = 0xff;
                                                  nonce_z[0xc] = 0xff;
                                                  nonce_z[0xd] = 0xff;
                                                  nonce_z[0xe] = 0xff;
                                                  nonce_z[0xf] = 0xff;
                                                  sha.buf[0x10] = 0xf2;
                                                  sha.buf[0x11] = '_';
                                                  sha.buf[0x12] = 0xd7;
                                                  sha.buf[0x13] = 0x88;
                                                  sha.buf[0x14] = 0x81;
                                                  sha.buf[0x15] = 0xeb;
                                                  sha.buf[0x16] = 0xb3;
                                                  sha.buf[0x17] = '\'';
                                                  sha.buf[0x18] = 'q';
                                                  sha.buf[0x19] = 0xfc;
                                                  sha.buf[0x1a] = 'Y';
                                                  sha.buf[0x1b] = '\"';
                                                  sha.buf[0x1c] = 0xef;
                                                  sha.buf[0x1d] = 0xc6;
                                                  sha.buf[0x1e] = 'n';
                                                  sha.buf[0x1f] = 0xa3;
                                                  sha.buf[0] = 0x97;
                                                  sha.buf[1] = 'X';
                                                  sha.buf[2] = '+';
                                                  sha.buf[3] = 0x9c;
                                                  sha.buf[4] = 0xb1;
                                                  sha.buf[5] = '=';
                                                  sha.buf[6] = 0xb3;
                                                  sha.buf[7] = 0x93;
                                                  sha.buf[8] = '7';
                                                  sha.buf[9] = '\x05';
                                                  sha.buf[10] = 0xb3;
                                                  sha.buf[0xb] = '+';
                                                  sha.buf[0xc] = 0xa9;
                                                  sha.buf[0xd] = 0x82;
                                                  sha.buf[0xe] = 0xaf;
                                                  sha.buf[0xf] = 'Z';
                                                  sha.s[4] = 0xa1c1ec65;
                                                  sha.s[5] = 0xb651dd87;
                                                  sha.s[6] = 0xdc1eda4f;
                                                  sha.s[7] = 0xecd53796;
                                                  sha.s[0] = 0x9750b07e;
                                                  sha.s[1] = 0xf146e257;
                                                  sha.s[2] = 0x56884994;
                                                  sha.s[3] = 0xb91c6151;
                                                  test_schnorrsig_bip_vectors_check_signing
                                                            ((uchar *)&sha_optimized,(uchar *)args,
                                                             nonce,nonce_z,0x20,(uchar *)&sha);
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            ((uchar *)args,nonce_z,0x20,
                                                             (uchar *)&sha,1);
                                                  sha_optimized.s[4] = 0x7430fa7d;
                                                  sha_optimized.s[5] = 0xaae28b6d;
                                                  sha_optimized.s[6] = 0x295f9765;
                                                  sha_optimized.s[7] = 0xb9c72dd2;
                                                  sha_optimized.s[0] = 0x9359cd6;
                                                  sha_optimized.s[1] = 0x12e499bb;
                                                  sha_optimized.s[2] = 0xe80f8be6;
                                                  sha_optimized.s[3] = 0x83724e54;
                                                  args[2] = (uchar *)0x9b591ac87578f199;
                                                  args[3] = (uchar *)0x36769b989986c56;
                                                  args[0] = (uchar *)0xb283cc8ff6c3f34d;
                                                  args[1] = (uchar *)0x24a73104c9429d7e;
                                                  sha.buf[0x10] = '`';
                                                  sha.buf[0x11] = 0xcb;
                                                  sha.buf[0x12] = 'q';
                                                  sha.buf[0x13] = 0xc0;
                                                  sha.buf[0x14] = 'N';
                                                  sha.buf[0x15] = 0x80;
                                                  sha.buf[0x16] = 0xf5;
                                                  sha.buf[0x17] = 0x93;
                                                  sha.buf[0x18] = '\x06';
                                                  sha.buf[0x19] = '\v';
                                                  sha.buf[0x1a] = '\a';
                                                  sha.buf[0x1b] = 0xd2;
                                                  sha.buf[0x1c] = 0x83;
                                                  sha.buf[0x1d] = '\b';
                                                  sha.buf[0x1e] = 0xd7;
                                                  sha.buf[0x1f] = 0xf4;
                                                  sha.buf[0] = 'v';
                                                  sha.buf[1] = 0xaf;
                                                  sha.buf[2] = 0xb1;
                                                  sha.buf[3] = 'T';
                                                  sha.buf[4] = 0x8a;
                                                  sha.buf[5] = 0xf6;
                                                  sha.buf[6] = '\x03';
                                                  sha.buf[7] = 0xb3;
                                                  sha.buf[8] = 0xeb;
                                                  sha.buf[9] = 'E';
                                                  sha.buf[10] = 0xc9;
                                                  sha.buf[0xb] = 0xf8;
                                                  sha.buf[0xc] = ' ';
                                                  sha.buf[0xd] = '}';
                                                  sha.buf[0xe] = 0xee;
                                                  sha.buf[0xf] = '\x10';
                                                  sha.s[4] = 0x94eda089;
                                                  sha.s[5] = 0x28aaf514;
                                                  sha.s[6] = 0xd6960dad;
                                                  sha.s[7] = 0x639c5f79;
                                                  sha.s[0] = 0;
                                                  sha.s[1] = 0;
                                                  sha.s[2] = 0x3b000000;
                                                  sha.s[3] = 0x3f56ce78;
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            ((uchar *)&sha_optimized,(uchar *)args,
                                                             0x20,(uchar *)&sha,1);
                                                  sha_optimized.s[4] = 0xae9898eb;
                                                  sha_optimized.s[5] = 0x8776b979;
                                                  sha_optimized.s[6] = 0xa0fae466;
                                                  sha_optimized.s[7] = 0x344a2d4a;
                                                  sha_optimized.s[0] = 0x4ceafdee;
                                                  sha_optimized.s[1] = 0x507767db;
                                                  sha_optimized.s[2] = 0xe8fe20a4;
                                                  sha_optimized.s[3] = 0x21cfea07;
                                                  iVar12 = secp256k1_xonly_pubkey_parse
                                                                     (CTX,(secp256k1_xonly_pubkey *)
                                                                          &sha,(uchar *)&
                                                  sha_optimized);
                                                  if (iVar12 == 0) {
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 'z';
                                                    sha.buf[0x11] = 's';
                                                    sha.buf[0x12] = 0xc6;
                                                    sha.buf[0x13] = 'C';
                                                    sha.buf[0x14] = 0xe1;
                                                    sha.buf[0x15] = 'f';
                                                    sha.buf[0x16] = 0xbe;
                                                    sha.buf[0x17] = '^';
                                                    sha.buf[0x18] = 0xbe;
                                                    sha.buf[0x19] = 0xaf;
                                                    sha.buf[0x1a] = 0xa3;
                                                    sha.buf[0x1b] = 'K';
                                                    sha.buf[0x1c] = '\x1a';
                                                    sha.buf[0x1d] = 0xc5;
                                                    sha.buf[0x1e] = 'S';
                                                    sha.buf[0x1f] = 0xe2;
                                                    sha.buf[0] = '<';
                                                    sha.buf[1] = 0xc2;
                                                    sha.buf[2] = 'y';
                                                    sha.buf[3] = 'D';
                                                    sha.buf[4] = 'd';
                                                    sha.buf[5] = '\n';
                                                    sha.buf[6] = 0xc6;
                                                    sha.buf[7] = '\a';
                                                    sha.buf[8] = 0xcd;
                                                    sha.buf[9] = '\x10';
                                                    sha.buf[10] = 'z';
                                                    sha.buf[0xb] = 0xe1;
                                                    sha.buf[0xc] = '\t';
                                                    sha.buf[0xd] = '#';
                                                    sha.buf[0xe] = 0xd9;
                                                    sha.buf[0xf] = 0xef;
                                                    sha.s[4] = 0x2f47f682;
                                                    sha.s[5] = 0x8ba16885;
                                                    sha.s[6] = 0x147a052f;
                                                    sha.s[7] = 0x56752960;
                                                    sha.s[0] = 0xd57bf9ff;
                                                    sha.s[1] = 0xa4ee5e75;
                                                    sha.s[2] = 0x143a4520;
                                                    sha.s[3] = 0xd3355235;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 'b';
                                                    sha.buf[0x11] = '*';
                                                    sha.buf[0x12] = 0x95;
                                                    sha.buf[0x13] = 'L';
                                                    sha.buf[0x14] = 0xfe;
                                                    sha.buf[0x15] = 'T';
                                                    sha.buf[0x16] = 'W';
                                                    sha.buf[0x17] = '5';
                                                    sha.buf[0x18] = 0xaa;
                                                    sha.buf[0x19] = 0xea;
                                                    sha.buf[0x1a] = 'Q';
                                                    sha.buf[0x1b] = '4';
                                                    sha.buf[0x1c] = 0xfc;
                                                    sha.buf[0x1d] = 0xcd;
                                                    sha.buf[0x1e] = 0xb2;
                                                    sha.buf[0x1f] = 0xbd;
                                                    sha.buf[0] = '(';
                                                    sha.buf[1] = 0x89;
                                                    sha.buf[2] = '\v';
                                                    sha.buf[3] = '>';
                                                    sha.buf[4] = 0xdb;
                                                    sha.buf[5] = 'n';
                                                    sha.buf[6] = 'q';
                                                    sha.buf[7] = 0x89;
                                                    sha.buf[8] = 0xb6;
                                                    sha.buf[9] = '0';
                                                    sha.buf[10] = 'D';
                                                    sha.buf[0xb] = 0x8b;
                                                    sha.buf[0xc] = 'Q';
                                                    sha.buf[0xd] = '\\';
                                                    sha.buf[0xe] = 0xe4;
                                                    sha.buf[0xf] = 0xf8;
                                                    sha.s[4] = 0x13b032b4;
                                                    sha.s[5] = 0xf46f3fdf;
                                                    sha.s[6] = 0x33cb9ff9;
                                                    sha.s[7] = 0x5f51e1e0;
                                                    sha.s[0] = 0x332ea61f;
                                                    sha.s[1] = 0x1cc2db1e;
                                                    sha.s[2] = 0xd2924739;
                                                    sha.s[3] = 0xa70011ab;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 0xe8;
                                                    sha.buf[0x11] = 0xd7;
                                                    sha.buf[0x12] = 0xc9;
                                                    sha.buf[0x13] = '>';
                                                    sha.buf[0x14] = '\0';
                                                    sha.buf[0x15] = 0xc5;
                                                    sha.buf[0x16] = 0xed;
                                                    sha.buf[0x17] = '\f';
                                                    sha.buf[0x18] = '\x18';
                                                    sha.buf[0x19] = '4';
                                                    sha.buf[0x1a] = 0xff;
                                                    sha.buf[0x1b] = '\r';
                                                    sha.buf[0x1c] = '\f';
                                                    sha.buf[0x1d] = '.';
                                                    sha.buf[0x1e] = 'm';
                                                    sha.buf[0x1f] = 0xa6;
                                                    sha.buf[0] = 0x96;
                                                    sha.buf[1] = '\x17';
                                                    sha.buf[2] = 'd';
                                                    sha.buf[3] = 0xb3;
                                                    sha.buf[4] = 0xaa;
                                                    sha.buf[5] = 0x9b;
                                                    sha.buf[6] = '/';
                                                    sha.buf[7] = 0xfc;
                                                    sha.buf[8] = 0xb6;
                                                    sha.buf[9] = 0xef;
                                                    sha.buf[10] = 0x94;
                                                    sha.buf[0xb] = '{';
                                                    sha.buf[0xc] = 'h';
                                                    sha.buf[0xd] = 0x87;
                                                    sha.buf[0xe] = 0xa2;
                                                    sha.buf[0xf] = '&';
                                                    sha.s[4] = 0x6097c174;
                                                    sha.s[5] = 0x96d9b289;
                                                    sha.s[6] = 0x54e5a23d;
                                                    sha.s[7] = 0x6977173e;
                                                    sha.s[0] = 0x3b5cff6c;
                                                    sha.s[1] = 0xea696ca8;
                                                    sha.s[2] = 0xf376734b;
                                                    sha.s[3] = 0x4fcb9b1a;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 'O';
                                                    sha.buf[0x11] = 0xb7;
                                                    sha.buf[0x12] = '4';
                                                    sha.buf[0x13] = 'v';
                                                    sha.buf[0x14] = 0xf0;
                                                    sha.buf[0x15] = 0xd5;
                                                    sha.buf[0x16] = 0x94;
                                                    sha.buf[0x17] = 0xdc;
                                                    sha.buf[0x18] = 0xb6;
                                                    sha.buf[0x19] = '\\';
                                                    sha.buf[0x1a] = 'd';
                                                    sha.buf[0x1b] = '%';
                                                    sha.buf[0x1c] = 0xbd;
                                                    sha.buf[0x1d] = '\x18';
                                                    sha.buf[0x1e] = '`';
                                                    sha.buf[0x1f] = 'Q';
                                                    sha.buf[0] = '\x12';
                                                    sha.buf[1] = '=';
                                                    sha.buf[2] = 0xda;
                                                    sha.buf[3] = 0x83;
                                                    sha.buf[4] = '(';
                                                    sha.buf[5] = 0xaf;
                                                    sha.buf[6] = 0x9c;
                                                    sha.buf[7] = '#';
                                                    sha.buf[8] = 0xa9;
                                                    sha.buf[9] = 'L';
                                                    sha.buf[10] = '\x1f';
                                                    sha.buf[0xb] = 0xee;
                                                    sha.buf[0xc] = 0xcf;
                                                    sha.buf[0xd] = 0xd1;
                                                    sha.buf[0xe] = '#';
                                                    sha.buf[0xf] = 0xba;
                                                    sha.s[4] = 0;
                                                    sha.s[5] = 0;
                                                    sha.s[6] = 0;
                                                    sha.s[7] = 0;
                                                    sha.s[0] = 0;
                                                    sha.s[1] = 0;
                                                    sha.s[2] = 0;
                                                    sha.s[3] = 0;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 0xdb;
                                                    sha.buf[0x11] = 0xa8;
                                                    sha.buf[0x12] = '\x7f';
                                                    sha.buf[0x13] = '\x11';
                                                    sha.buf[0x14] = 0xac;
                                                    sha.buf[0x15] = 'g';
                                                    sha.buf[0x16] = 'T';
                                                    sha.buf[0x17] = 0xf9;
                                                    sha.buf[0x18] = '7';
                                                    sha.buf[0x19] = 0x80;
                                                    sha.buf[0x1a] = 0xd5;
                                                    sha.buf[0x1b] = 0xa1;
                                                    sha.buf[0x1c] = 0x83;
                                                    sha.buf[0x1d] = '|';
                                                    sha.buf[0x1e] = 0xf1;
                                                    sha.buf[0x1f] = 0x97;
                                                    sha.buf[0] = 'v';
                                                    sha.buf[1] = '\x15';
                                                    sha.buf[2] = 0xfb;
                                                    sha.buf[3] = 0xaf;
                                                    sha.buf[4] = 'Z';
                                                    sha.buf[5] = 0xe2;
                                                    sha.buf[6] = 0x88;
                                                    sha.buf[7] = 'd';
                                                    sha.buf[8] = '\x01';
                                                    sha.buf[9] = '<';
                                                    sha.buf[10] = '\t';
                                                    sha.buf[0xb] = 0x97;
                                                    sha.buf[0xc] = 'B';
                                                    sha.buf[0xd] = 0xde;
                                                    sha.buf[0xe] = 0xad;
                                                    sha.buf[0xf] = 0xb4;
                                                    sha.s[4] = 0;
                                                    sha.s[5] = 0;
                                                    sha.s[6] = 0;
                                                    sha.s[7] = 0x1000000;
                                                    sha.s[0] = 0;
                                                    sha.s[1] = 0;
                                                    sha.s[2] = 0;
                                                    sha.s[3] = 0;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 0xd1;
                                                    sha.buf[0x11] = 0xd7;
                                                    sha.buf[0x12] = '\x13';
                                                    sha.buf[0x13] = 0xa8;
                                                    sha.buf[0x14] = 0xae;
                                                    sha.buf[0x15] = 0x82;
                                                    sha.buf[0x16] = 0xb3;
                                                    sha.buf[0x17] = '/';
                                                    sha.buf[0x18] = 0xa7;
                                                    sha.buf[0x19] = 0x9d;
                                                    sha.buf[0x1a] = '_';
                                                    sha.buf[0x1b] = '\x7f';
                                                    sha.buf[0x1c] = 0xc4;
                                                    sha.buf[0x1d] = '\a';
                                                    sha.buf[0x1e] = 0xd3;
                                                    sha.buf[0x1f] = 0x9b;
                                                    sha.buf[0] = 'i';
                                                    sha.buf[1] = 0xe8;
                                                    sha.buf[2] = 0x9b;
                                                    sha.buf[3] = 'L';
                                                    sha.buf[4] = 'U';
                                                    sha.buf[5] = 'd';
                                                    sha.buf[6] = 0xd0;
                                                    sha.buf[7] = '\x03';
                                                    sha.buf[8] = 'I';
                                                    sha.buf[9] = '\x10';
                                                    sha.buf[10] = 'k';
                                                    sha.buf[0xb] = 0x84;
                                                    sha.buf[0xc] = 0x97;
                                                    sha.buf[0xd] = 'x';
                                                    sha.buf[0xe] = ']';
                                                    sha.buf[0xf] = 0xd7;
                                                    sha.s[4] = 0x2ba84d56;
                                                    sha.s[5] = 0xc79b260f;
                                                    sha.s[6] = 0x22f8740a;
                                                    sha.s[7] = 0x1dba2904;
                                                    sha.s[0] = 0xac8d294a;
                                                    sha.s[1] = 0x5a3957ae;
                                                    sha.s[2] = 0x5d79d015;
                                                    sha.s[3] = 0xcb1dfddb;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 0xd1;
                                                    sha.buf[0x11] = 0xd7;
                                                    sha.buf[0x12] = '\x13';
                                                    sha.buf[0x13] = 0xa8;
                                                    sha.buf[0x14] = 0xae;
                                                    sha.buf[0x15] = 0x82;
                                                    sha.buf[0x16] = 0xb3;
                                                    sha.buf[0x17] = '/';
                                                    sha.buf[0x18] = 0xa7;
                                                    sha.buf[0x19] = 0x9d;
                                                    sha.buf[0x1a] = '_';
                                                    sha.buf[0x1b] = '\x7f';
                                                    sha.buf[0x1c] = 0xc4;
                                                    sha.buf[0x1d] = '\a';
                                                    sha.buf[0x1e] = 0xd3;
                                                    sha.buf[0x1f] = 0x9b;
                                                    sha.buf[0] = 'i';
                                                    sha.buf[1] = 0xe8;
                                                    sha.buf[2] = 0x9b;
                                                    sha.buf[3] = 'L';
                                                    sha.buf[4] = 'U';
                                                    sha.buf[5] = 'd';
                                                    sha.buf[6] = 0xd0;
                                                    sha.buf[7] = '\x03';
                                                    sha.buf[8] = 'I';
                                                    sha.buf[9] = '\x10';
                                                    sha.buf[10] = 'k';
                                                    sha.buf[0xb] = 0x84;
                                                    sha.buf[0xc] = 0x97;
                                                    sha.buf[0xd] = 'x';
                                                    sha.buf[0xe] = ']';
                                                    sha.buf[0xf] = 0xd7;
                                                    sha.s[4] = 0xffffffff;
                                                    sha.s[5] = 0xffffffff;
                                                    sha.s[6] = 0xfeffffff;
                                                    sha.s[7] = 0x2ffcffff;
                                                    sha.s[0] = 0xffffffff;
                                                    sha.s[1] = 0xffffffff;
                                                    sha.s[2] = 0xffffffff;
                                                    sha.s[3] = 0xffffffff;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0x1daefe58;
                                                    sha_optimized.s[5] = 0xd8cedea2;
                                                    sha_optimized.s[6] = 0x7b0f2443;
                                                    sha_optimized.s[7] = 0x59a62b50;
                                                    sha_optimized.s[0] = 0x7fd7f1df;
                                                    sha_optimized.s[1] = 0x5f1c672a;
                                                    sha_optimized.s[2] = 0x26371836;
                                                    sha_optimized.s[3] = 0xbe4123db;
                                                    args[2] = (uchar *)0xd0319f29223809a4;
                                                    args[3] = (uchar *)0x896c4eec98fa2e08;
                                                    args[0] = (uchar *)0xd308a385886a3f24;
                                                    args[1] = (uchar *)0x447370032e8a1913;
                                                    sha.buf[0x10] = 0xba;
                                                    sha.buf[0x11] = 0xae;
                                                    sha.buf[0x12] = 0xdc;
                                                    sha.buf[0x13] = 0xe6;
                                                    sha.buf[0x14] = 0xaf;
                                                    sha.buf[0x15] = 'H';
                                                    sha.buf[0x16] = 0xa0;
                                                    sha.buf[0x17] = ';';
                                                    sha.buf[0x18] = 0xbf;
                                                    sha.buf[0x19] = 0xd2;
                                                    sha.buf[0x1a] = '^';
                                                    sha.buf[0x1b] = 0x8c;
                                                    sha.buf[0x1c] = 0xd0;
                                                    sha.buf[0x1d] = '6';
                                                    sha.buf[0x1e] = 'A';
                                                    sha.buf[0x1f] = 'A';
                                                    sha.buf[0] = 0xff;
                                                    sha.buf[1] = 0xff;
                                                    sha.buf[2] = 0xff;
                                                    sha.buf[3] = 0xff;
                                                    sha.buf[4] = 0xff;
                                                    sha.buf[5] = 0xff;
                                                    sha.buf[6] = 0xff;
                                                    sha.buf[7] = 0xff;
                                                    sha.buf[8] = 0xff;
                                                    sha.buf[9] = 0xff;
                                                    sha.buf[10] = 0xff;
                                                    sha.buf[0xb] = 0xff;
                                                    sha.buf[0xc] = 0xff;
                                                    sha.buf[0xd] = 0xff;
                                                    sha.buf[0xe] = 0xff;
                                                    sha.buf[0xf] = 0xfe;
                                                    sha.s[4] = 0x6097c174;
                                                    sha.s[5] = 0x96d9b289;
                                                    sha.s[6] = 0x54e5a23d;
                                                    sha.s[7] = 0x6977173e;
                                                    sha.s[0] = 0x3b5cff6c;
                                                    sha.s[1] = 0xea696ca8;
                                                    sha.s[2] = 0xf376734b;
                                                    sha.s[3] = 0x4fcb9b1a;
                                                    test_schnorrsig_bip_vectors_check_verify
                                                              ((uchar *)&sha_optimized,(uchar *)args
                                                               ,0x20,(uchar *)&sha,0);
                                                    sha_optimized.s[4] = 0xffffffff;
                                                    sha_optimized.s[5] = 0xffffffff;
                                                    sha_optimized.s[6] = 0xfeffffff;
                                                    sha_optimized.s[7] = 0x30fcffff;
                                                    sha_optimized.s[0] = 0xffffffff;
                                                    sha_optimized.s[1] = 0xffffffff;
                                                    sha_optimized.s[2] = 0xffffffff;
                                                    sha_optimized.s[3] = 0xffffffff;
                                                    iVar12 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&sha,
                                                                        (uchar *)&sha_optimized);
                                                    if (iVar12 == 0) {
                                                      sha_optimized.s[4] = 0x40034003;
                                                      sha_optimized.s[5] = 0x40034003;
                                                      sha_optimized.s[6] = 0x40034003;
                                                      sha_optimized.s[7] = 0x40034003;
                                                      sha_optimized.s[0] = 0x40034003;
                                                      sha_optimized.s[1] = 0x40034003;
                                                      sha_optimized.s[2] = 0x40034003;
                                                      sha_optimized.s[3] = 0x40034003;
                                                      args[2] = (uchar *)0x238be6f6b6faf94b;
                                                      args[3] = (uchar *)0x17d16f4d32976408;
                                                      args[0] = (uchar *)0xc43a39b453aa8c77;
                                                      args[1] = (uchar *)0x22877a49094d7767;
                                                      nonce._16_16_ = ZEXT816(0);
                                                      nonce._0_16_ = ZEXT816(0);
                                                      sha.buf[0x10] = 0x9f;
                                                      sha.buf[0x11] = '-';
                                                      sha.buf[0x12] = 'V';
                                                      sha.buf[0x13] = '\x0f';
                                                      sha.buf[0x14] = 0xac;
                                                      sha.buf[0x15] = 'e';
                                                      sha.buf[0x16] = '(';
                                                      sha.buf[0x17] = '\'';
                                                      sha.buf[0x18] = 0xd1;
                                                      sha.buf[0x19] = 0xaf;
                                                      sha.buf[0x1a] = '\x05';
                                                      sha.buf[0x1b] = 't';
                                                      sha.buf[0x1c] = 0xe4;
                                                      sha.buf[0x1d] = '\'';
                                                      sha.buf[0x1e] = 0xab;
                                                      sha.buf[0x1f] = 'c';
                                                      sha.buf[0] = '`';
                                                      sha.buf[1] = 'i';
                                                      sha.buf[2] = 0xce;
                                                      sha.buf[3] = '&';
                                                      sha.buf[4] = 0xbf;
                                                      sha.buf[5] = '\x03';
                                                      sha.buf[6] = 'F';
                                                      sha.buf[7] = 'b';
                                                      sha.buf[8] = '(';
                                                      sha.buf[9] = 0xf1;
                                                      sha.buf[10] = 0x9a;
                                                      sha.buf[0xb] = ':';
                                                      sha.buf[0xc] = 'b';
                                                      sha.buf[0xd] = 0xdb;
                                                      sha.buf[0xe] = 0x8a;
                                                      sha.buf[0xf] = 'd';
                                                      sha.s[4] = 0x43adb66b;
                                                      sha.s[5] = 0xccfc3267;
                                                      sha.s[6] = 0x551a2925;
                                                      sha.s[7] = 0xcf645489;
                                                      sha.s[0] = 0xb15d5371;
                                                      sha.s[1] = 0xfbd9ec65;
                                                      sha.s[2] = 0x5f6e04bc;
                                                      sha.s[3] = 0x1861eafa;
                                                      test_schnorrsig_bip_vectors_check_signing
                                                                ((uchar *)&sha_optimized,
                                                                 (uchar *)args,nonce,(uchar *)0x0,0,
                                                                 (uchar *)&sha);
                                                      test_schnorrsig_bip_vectors_check_verify
                                                                ((uchar *)args,(uchar *)0x0,0,
                                                                 (uchar *)&sha,1);
                                                      sha_optimized.s[4] = 0x40034003;
                                                      sha_optimized.s[5] = 0x40034003;
                                                      sha_optimized.s[6] = 0x40034003;
                                                      sha_optimized.s[7] = 0x40034003;
                                                      sha_optimized.s[0] = 0x40034003;
                                                      sha_optimized.s[1] = 0x40034003;
                                                      sha_optimized.s[2] = 0x40034003;
                                                      sha_optimized.s[3] = 0x40034003;
                                                      args[2] = (uchar *)0x238be6f6b6faf94b;
                                                      args[3] = (uchar *)0x17d16f4d32976408;
                                                      args[0] = (uchar *)0xc43a39b453aa8c77;
                                                      args[1] = (uchar *)0x22877a49094d7767;
                                                      nonce._16_16_ = ZEXT816(0);
                                                      nonce._0_16_ = ZEXT816(0);
                                                      nonce_z[0] = '\x11';
                                                      sha.buf[0x10] = 0xfe;
                                                      sha.buf[0x11] = '|';
                                                      sha.buf[0x12] = 0xac;
                                                      sha.buf[0x13] = 0xfc;
                                                      sha.buf[0x14] = 'Z';
                                                      sha.buf[0x15] = 'W';
                                                      sha.buf[0x16] = '}';
                                                      sha.buf[0x17] = '3';
                                                      sha.buf[0x18] = 0xec;
                                                      sha.buf[0x19] = '\x14';
                                                      sha.buf[0x1a] = 'V';
                                                      sha.buf[0x1b] = 'L';
                                                      sha.buf[0x1c] = 0xec;
                                                      sha.buf[0x1d] = '+';
                                                      sha.buf[0x1e] = 0xac;
                                                      sha.buf[0x1f] = 0xbf;
                                                      sha.buf[0] = 0xea;
                                                      sha.buf[1] = '1';
                                                      sha.buf[2] = 's';
                                                      sha.buf[3] = 0xbf;
                                                      sha.buf[4] = 0xea;
                                                      sha.buf[5] = 'f';
                                                      sha.buf[6] = 0x83;
                                                      sha.buf[7] = 0xbd;
                                                      sha.buf[8] = '\x10';
                                                      sha.buf[9] = '\x1f';
                                                      sha.buf[10] = 0xa5;
                                                      sha.buf[0xb] = 0xaa;
                                                      sha.buf[0xc] = ']';
                                                      sha.buf[0xd] = 0xbc;
                                                      sha.buf[0xe] = '\x19';
                                                      sha.buf[0xf] = 0x96;
                                                      sha.s[4] = 0x4a93b9b1;
                                                      sha.s[5] = 0x354c3be6;
                                                      sha.s[6] = 0x11aef311;
                                                      sha.s[7] = 0x3a3c634;
                                                      sha.s[0] = 0xa0aa208;
                                                      sha.s[1] = 0x2441f6fe;
                                                      sha.s[2] = 0xe0329264;
                                                      sha.s[3] = 0x3a583c69;
                                                      test_schnorrsig_bip_vectors_check_signing
                                                                ((uchar *)&sha_optimized,
                                                                 (uchar *)args,nonce,nonce_z,1,
                                                                 (uchar *)&sha);
                                                      test_schnorrsig_bip_vectors_check_verify
                                                                ((uchar *)args,nonce_z,1,
                                                                 (uchar *)&sha,1);
                                                      sha_optimized.s[4] = 0x40034003;
                                                      sha_optimized.s[5] = 0x40034003;
                                                      sha_optimized.s[6] = 0x40034003;
                                                      sha_optimized.s[7] = 0x40034003;
                                                      sha_optimized.s[0] = 0x40034003;
                                                      sha_optimized.s[1] = 0x40034003;
                                                      sha_optimized.s[2] = 0x40034003;
                                                      sha_optimized.s[3] = 0x40034003;
                                                      args[2] = (uchar *)0x238be6f6b6faf94b;
                                                      args[3] = (uchar *)0x17d16f4d32976408;
                                                      args[0] = (uchar *)0xc43a39b453aa8c77;
                                                      args[1] = (uchar *)0x22877a49094d7767;
                                                      nonce._16_16_ = ZEXT816(0);
                                                      nonce._0_16_ = ZEXT816(0);
                                                      builtin_memcpy(nonce_z,
                                                  "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11"
                                                  ,0x11);
                                                  sha.buf[0x10] = 0xe1;
                                                  sha.buf[0x11] = 0xe5;
                                                  sha.buf[0x12] = 0xa3;
                                                  sha.buf[0x13] = '\x7f';
                                                  sha.buf[0x14] = 0xd8;
                                                  sha.buf[0x15] = '\x0e';
                                                  sha.buf[0x16] = 'Z';
                                                  sha.buf[0x17] = 'Q';
                                                  sha.buf[0x18] = 0x89;
                                                  sha.buf[0x19] = '|';
                                                  sha.buf[0x1a] = 'U';
                                                  sha.buf[0x1b] = 'f';
                                                  sha.buf[0x1c] = 0xa9;
                                                  sha.buf[0x1d] = '~';
                                                  sha.buf[0x1e] = 0xa5;
                                                  sha.buf[0x1f] = 0xa5;
                                                  sha.buf[0] = 0xc4;
                                                  sha.buf[1] = 0xa4;
                                                  sha.buf[2] = 0x82;
                                                  sha.buf[3] = 0xb7;
                                                  sha.buf[4] = '{';
                                                  sha.buf[5] = 0xf9;
                                                  sha.buf[6] = '`';
                                                  sha.buf[7] = 0xf8;
                                                  sha.buf[8] = 'h';
                                                  sha.buf[9] = '\x15';
                                                  sha.buf[10] = '@';
                                                  sha.buf[0xb] = 0xe2;
                                                  sha.buf[0xc] = '[';
                                                  sha.buf[0xd] = 'g';
                                                  sha.buf[0xe] = 'q';
                                                  sha.buf[0xf] = 0xec;
                                                  sha.s[4] = 0xd199865d;
                                                  sha.s[5] = 0x523c1ea7;
                                                  sha.s[6] = 0xb6fd9ada;
                                                  sha.s[7] = 0x70c30ab5;
                                                  sha.s[0] = 0x9af33051;
                                                  sha.s[1] = 0x3bb45940;
                                                  sha.s[2] = 0x9ac0cac7;
                                                  sha.s[3] = 0x2be5ec19;
                                                  test_schnorrsig_bip_vectors_check_signing
                                                            ((uchar *)&sha_optimized,(uchar *)args,
                                                             nonce,nonce_z,0x11,(uchar *)&sha);
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            ((uchar *)args,nonce_z,0x11,
                                                             (uchar *)&sha,1);
                                                  args[2] = (uchar *)0x4003400340034003;
                                                  args[3] = (uchar *)0x4003400340034003;
                                                  args[0] = (uchar *)0x4003400340034003;
                                                  args[1] = (uchar *)0x4003400340034003;
                                                  nonce[0x18] = '\b';
                                                  nonce[0x19] = 'd';
                                                  nonce[0x1a] = 0x97;
                                                  nonce[0x1b] = '2';
                                                  nonce[0x1c] = 'M';
                                                  nonce[0x1d] = 'o';
                                                  nonce[0x1e] = 0xd1;
                                                  nonce[0x1f] = '\x17';
                                                  nonce[0x10] = 'K';
                                                  nonce[0x11] = 0xf9;
                                                  nonce[0x12] = 0xfa;
                                                  nonce[0x13] = 0xb6;
                                                  nonce[0x14] = 0xf6;
                                                  nonce[0x15] = 0xe6;
                                                  nonce[0x16] = 0x8b;
                                                  nonce[0x17] = '#';
                                                  nonce[8] = 'g';
                                                  nonce[9] = 'w';
                                                  nonce[10] = 'M';
                                                  nonce[0xb] = '\t';
                                                  nonce[0xc] = 'I';
                                                  nonce[0xd] = 'z';
                                                  nonce[0xe] = 0x87;
                                                  nonce[0xf] = '\"';
                                                  nonce[0] = 'w';
                                                  nonce[1] = 0x8c;
                                                  nonce[2] = 0xaa;
                                                  nonce[3] = 'S';
                                                  nonce[4] = 0xb4;
                                                  nonce[5] = '9';
                                                  nonce[6] = ':';
                                                  nonce[7] = 0xc4;
                                                  nonce_z[0x10] = '\0';
                                                  nonce_z[0x11] = '\0';
                                                  nonce_z[0x12] = '\0';
                                                  nonce_z[0x13] = '\0';
                                                  nonce_z[0x14] = '\0';
                                                  nonce_z[0x15] = '\0';
                                                  nonce_z[0x16] = '\0';
                                                  nonce_z[0x17] = '\0';
                                                  nonce_z[0x18] = '\0';
                                                  nonce_z[0x19] = '\0';
                                                  nonce_z[0x1a] = '\0';
                                                  nonce_z[0x1b] = '\0';
                                                  nonce_z[0x1c] = '\0';
                                                  nonce_z[0x1d] = '\0';
                                                  nonce_z[0x1e] = '\0';
                                                  nonce_z[0x1f] = '\0';
                                                  nonce_z[0] = '\0';
                                                  nonce_z[1] = '\0';
                                                  nonce_z[2] = '\0';
                                                  nonce_z[3] = '\0';
                                                  nonce_z[4] = '\0';
                                                  nonce_z[5] = '\0';
                                                  nonce_z[6] = '\0';
                                                  nonce_z[7] = '\0';
                                                  nonce_z[8] = '\0';
                                                  nonce_z[9] = '\0';
                                                  nonce_z[10] = '\0';
                                                  nonce_z[0xb] = '\0';
                                                  nonce_z[0xc] = '\0';
                                                  nonce_z[0xd] = '\0';
                                                  nonce_z[0xe] = '\0';
                                                  nonce_z[0xf] = '\0';
                                                  sha_optimized.buf[0x10] = 0x89;
                                                  sha_optimized.buf[0x11] = '\x7f';
                                                  sha_optimized.buf[0x12] = 0xcb;
                                                  sha_optimized.buf[0x13] = 0xa0;
                                                  sha_optimized.buf[0x14] = 0xe9;
                                                  sha_optimized.buf[0x15] = 0xd0;
                                                  sha_optimized.buf[0x16] = 0xb4;
                                                  sha_optimized.buf[0x17] = 0xa0;
                                                  sha_optimized.buf[0x18] = 'h';
                                                  sha_optimized.buf[0x19] = 0x94;
                                                  sha_optimized.buf[0x1a] = 0xcf;
                                                  sha_optimized.buf[0x1b] = 0xd2;
                                                  sha_optimized.buf[0x1c] = 'I';
                                                  sha_optimized.buf[0x1d] = 0xf2;
                                                  sha_optimized.buf[0x1e] = '#';
                                                  sha_optimized.buf[0x1f] = 'g';
                                                  sha_optimized.buf[0] = 'X';
                                                  sha_optimized.buf[1] = '^';
                                                  sha_optimized.buf[2] = 0xd3;
                                                  sha_optimized.buf[3] = 0xe3;
                                                  sha_optimized.buf[4] = '\x17';
                                                  sha_optimized.buf[5] = '\b';
                                                  sha_optimized.buf[6] = '\a';
                                                  sha_optimized.buf[7] = 0xe7;
                                                  sha_optimized.buf[8] = 0xc0;
                                                  sha_optimized.buf[9] = ';';
                                                  sha_optimized.buf[10] = 'r';
                                                  sha_optimized.buf[0xb] = '\x0f';
                                                  sha_optimized.buf[0xc] = 0xc5;
                                                  sha_optimized.buf[0xd] = 'L';
                                                  sha_optimized.buf[0xe] = '{';
                                                  sha_optimized.buf[0xf] = '#';
                                                  sha_optimized.s[4] = 0x5d1e3203;
                                                  sha_optimized.s[5] = 0x6fbea8bf;
                                                  sha_optimized.s[6] = 0x16351609;
                                                  sha_optimized.s[7] = 0xa879ca3e;
                                                  sha_optimized.s[0] = 0xb0123b40;
                                                  sha_optimized.s[1] = 0x345a55d8;
                                                  sha_optimized.s[2] = 0x7eea7541;
                                                  sha_optimized.s[3] = 0x635646c7;
                                                  sha.buf[0x30] = 0x99;
                                                  sha.buf[0x31] = 0x99;
                                                  sha.buf[0x32] = 0x99;
                                                  sha.buf[0x33] = 0x99;
                                                  sha.buf[0x34] = 0x99;
                                                  sha.buf[0x35] = 0x99;
                                                  sha.buf[0x36] = 0x99;
                                                  sha.buf[0x37] = 0x99;
                                                  sha.buf[0x38] = 0x99;
                                                  sha.buf[0x39] = 0x99;
                                                  sha.buf[0x3a] = 0x99;
                                                  sha.buf[0x3b] = 0x99;
                                                  sha.buf[0x3c] = 0x99;
                                                  sha.buf[0x3d] = 0x99;
                                                  sha.buf[0x3e] = 0x99;
                                                  sha.buf[0x3f] = 0x99;
                                                  sha.buf[0x20] = 0x99;
                                                  sha.buf[0x21] = 0x99;
                                                  sha.buf[0x22] = 0x99;
                                                  sha.buf[0x23] = 0x99;
                                                  sha.buf[0x24] = 0x99;
                                                  sha.buf[0x25] = 0x99;
                                                  sha.buf[0x26] = 0x99;
                                                  sha.buf[0x27] = 0x99;
                                                  sha.buf[0x28] = 0x99;
                                                  sha.buf[0x29] = 0x99;
                                                  sha.buf[0x2a] = 0x99;
                                                  sha.buf[0x2b] = 0x99;
                                                  sha.buf[0x2c] = 0x99;
                                                  sha.buf[0x2d] = 0x99;
                                                  sha.buf[0x2e] = 0x99;
                                                  sha.buf[0x2f] = 0x99;
                                                  sha.buf[0x10] = 0x99;
                                                  sha.buf[0x11] = 0x99;
                                                  sha.buf[0x12] = 0x99;
                                                  sha.buf[0x13] = 0x99;
                                                  sha.buf[0x14] = 0x99;
                                                  sha.buf[0x15] = 0x99;
                                                  sha.buf[0x16] = 0x99;
                                                  sha.buf[0x17] = 0x99;
                                                  sha.buf[0x18] = 0x99;
                                                  sha.buf[0x19] = 0x99;
                                                  sha.buf[0x1a] = 0x99;
                                                  sha.buf[0x1b] = 0x99;
                                                  sha.buf[0x1c] = 0x99;
                                                  sha.buf[0x1d] = 0x99;
                                                  sha.buf[0x1e] = 0x99;
                                                  sha.buf[0x1f] = 0x99;
                                                  sha.buf[0] = 0x99;
                                                  sha.buf[1] = 0x99;
                                                  sha.buf[2] = 0x99;
                                                  sha.buf[3] = 0x99;
                                                  sha.buf[4] = 0x99;
                                                  sha.buf[5] = 0x99;
                                                  sha.buf[6] = 0x99;
                                                  sha.buf[7] = 0x99;
                                                  sha.buf[8] = 0x99;
                                                  sha.buf[9] = 0x99;
                                                  sha.buf[10] = 0x99;
                                                  sha.buf[0xb] = 0x99;
                                                  sha.buf[0xc] = 0x99;
                                                  sha.buf[0xd] = 0x99;
                                                  sha.buf[0xe] = 0x99;
                                                  sha.buf[0xf] = 0x99;
                                                  sha.s[4] = 0x99999999;
                                                  sha.s[5] = 0x99999999;
                                                  sha.s[6] = 0x99999999;
                                                  sha.s[7] = 0x99999999;
                                                  sha.s[0] = 0x99999999;
                                                  sha.s[1] = 0x99999999;
                                                  sha.s[2] = 0x99999999;
                                                  sha.s[3] = 0x99999999;
                                                  sha.bytes._0_4_ = 0x99999999;
                                                  test_schnorrsig_bip_vectors_check_signing
                                                            ((uchar *)args,nonce,nonce_z,
                                                             (uchar *)&sha,100,
                                                             (uchar *)&sha_optimized);
                                                  test_schnorrsig_bip_vectors_check_verify
                                                            (nonce,(uchar *)&sha,100,
                                                             (uchar *)&sha_optimized,1);
                                                  iVar12 = 0;
                                                  while( true ) {
                                                    if (COUNT <= iVar12) break;
                                                    builtin_memcpy(key + 0x10,"r a schnorrsig..",
                                                                   0x10);
                                                    builtin_memcpy(key,"this is a msg fo",0x10);
                                                    nonce_z[0x10] = '\0';
                                                    nonce_z[0x11] = '\0';
                                                    nonce_z[0x12] = '\0';
                                                    nonce_z[0x13] = '\0';
                                                    nonce_z[0x14] = '\0';
                                                    nonce_z[0x15] = '\0';
                                                    nonce_z[0x16] = '\0';
                                                    nonce_z[0x17] = '\0';
                                                    nonce_z[0x18] = '\0';
                                                    nonce_z[0x19] = '\0';
                                                    nonce_z[0x1a] = '\0';
                                                    nonce_z[0x1b] = '\0';
                                                    nonce_z[0x1c] = '\0';
                                                    nonce_z[0x1d] = '\0';
                                                    nonce_z[0x1e] = '\0';
                                                    nonce_z[0x1f] = '\0';
                                                    nonce_z[0] = '\0';
                                                    nonce_z[1] = '\0';
                                                    nonce_z[2] = '\0';
                                                    nonce_z[3] = '\0';
                                                    nonce_z[4] = '\0';
                                                    nonce_z[5] = '\0';
                                                    nonce_z[6] = '\0';
                                                    nonce_z[7] = '\0';
                                                    nonce_z[8] = '\0';
                                                    nonce_z[9] = '\0';
                                                    nonce_z[10] = '\0';
                                                    nonce_z[0xb] = '\0';
                                                    nonce_z[0xc] = '\0';
                                                    nonce_z[0xd] = '\0';
                                                    nonce_z[0xe] = '\0';
                                                    nonce_z[0xf] = '\0';
                                                    auVar1._8_8_ = 0;
                                                    auVar1[0] = aux_rand[0x18];
                                                    auVar1[1] = aux_rand[0x19];
                                                    auVar1[2] = aux_rand[0x1a];
                                                    auVar1[3] = aux_rand[0x1b];
                                                    auVar1[4] = aux_rand[0x1c];
                                                    auVar1[5] = aux_rand[0x1d];
                                                    auVar1[6] = aux_rand[0x1e];
                                                    auVar1[7] = aux_rand[0x1f];
                                                    aux_rand._16_16_ = auVar1 << 0x40;
                                                    aux_rand._0_16_ = ZEXT816(0x8cb36fda);
                                                    testrand256(msg);
                                                    testrand256(pk);
                                                    iVar4 = secp256k1_keypair_create
                                                                      (CTX,(secp256k1_keypair *)&sha
                                                                       ,msg);
                                                    if (iVar4 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk)"
                                                  ;
                                                  uVar14 = 0x332;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_keypair_xonly_pub
                                                                    (CTX,(secp256k1_xonly_pubkey *)
                                                                         &sha_optimized,(int *)0x0,
                                                                     (secp256k1_keypair *)&sha);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair)"
                                                  ;
                                                  uVar14 = 0x333;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign32
                                                                    (CTX,(uchar *)args,key,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (uchar *)0x0);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, NULL) == 1"
                                                  ;
                                                  uVar14 = 0x334;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     &sha_optimized);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk)"
                                                  ;
                                                  uVar14 = 0x335;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign32
                                                                    (CTX,nonce,key,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (uchar *)0x0);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign(CTX, sig2, msg, &keypair, NULL) == 1"
                                                  ;
                                                  uVar14 = 0x337;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_memcmp_var
                                                                    (args,(secp256k1_keypair *)nonce
                                                                     ,0x40);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(sig, sig2, sizeof(sig)) == 0"
                                                  ;
                                                  uVar14 = 0x338;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)aux_rand);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1"
                                                  ;
                                                  uVar14 = 0x33b;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     &sha_optimized);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk)"
                                                  ;
                                                  uVar14 = 0x33c;
                                                  goto LAB_00128441;
                                                  }
                                                  args[4] = (uchar *)0x101010101010101;
                                                  args[2] = (uchar *)0x101010101010101;
                                                  args[3] = (uchar *)0x101010101010101;
                                                  args[0] = (uchar *)0x101010101010101;
                                                  args[1] = (uchar *)0x101010101010101;
                                                  aux_rand._8_8_ = nonce_function_failing;
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)aux_rand);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 0"
                                                  ;
                                                  uVar14 = 0x33f;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_memcmp_var(args,nonce_z,0x40);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(sig, zeros64, sizeof(sig)) == 0"
                                                  ;
                                                  uVar14 = 0x340;
                                                  goto LAB_00128441;
                                                  }
                                                  args[4] = (uchar *)0x101010101010101;
                                                  args[2] = (uchar *)0x101010101010101;
                                                  args[3] = (uchar *)0x101010101010101;
                                                  args[0] = (uchar *)0x101010101010101;
                                                  args[1] = (uchar *)0x101010101010101;
                                                  aux_rand._8_8_ = nonce_function_0;
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)aux_rand);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 0"
                                                  ;
                                                  uVar14 = 0x343;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_memcmp_var(args,nonce_z,0x40);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(sig, zeros64, sizeof(sig)) == 0"
                                                  ;
                                                  uVar14 = 0x344;
                                                  goto LAB_00128441;
                                                  }
                                                  args[4] = (uchar *)0x101010101010101;
                                                  args[2] = (uchar *)0x101010101010101;
                                                  args[3] = (uchar *)0x101010101010101;
                                                  args[0] = (uchar *)0x101010101010101;
                                                  args[1] = (uchar *)0x101010101010101;
                                                  aux_rand._8_8_ = nonce_function_overflowing;
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)aux_rand);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1"
                                                  ;
                                                  uVar14 = 0x347;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     &sha_optimized);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &pk)"
                                                  ;
                                                  uVar14 = 0x348;
                                                  goto LAB_00128441;
                                                  }
                                                  aux_rand[8] = '\0';
                                                  aux_rand[9] = '\0';
                                                  aux_rand[10] = '\0';
                                                  aux_rand[0xb] = '\0';
                                                  aux_rand[0xc] = '\0';
                                                  aux_rand[0xd] = '\0';
                                                  aux_rand[0xe] = '\0';
                                                  aux_rand[0xf] = '\0';
                                                  aux_rand._16_8_ = pk;
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)args,key,0x20,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)aux_rand);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypair, &extraparams) == 1"
                                                  ;
                                                  uVar14 = 0x34e;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign32
                                                                    (CTX,nonce,key,
                                                                     (secp256k1_keypair *)&sha,
                                                                     (uchar *)aux_rand._16_8_);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig2, msg, &keypair, extraparams.ndata) == 1"
                                                  ;
                                                  uVar14 = 0x34f;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_memcmp_var
                                                                    (args,(secp256k1_keypair *)nonce
                                                                     ,0x40);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_memcmp_var(sig, sig2, sizeof(sig)) == 0"
                                                  ;
                                                  uVar14 = 0x350;
                                                  goto LAB_00128441;
                                                  }
                                                  testrand256(msg);
                                                  iVar4 = secp256k1_keypair_create
                                                                    (CTX,(secp256k1_keypair *)nonce,
                                                                     msg);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk)"
                                                  ;
                                                  uVar14 = 0x361;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_keypair_xonly_pub
                                                                    (CTX,(secp256k1_xonly_pubkey *)
                                                                         nonce_z,(int *)0x0,
                                                                     (secp256k1_keypair *)nonce);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair)"
                                                  ;
                                                  uVar14 = 0x362;
                                                  goto LAB_00128441;
                                                  }
                                                  lVar8 = 0;
                                                  sig64 = &sha_optimized;
                                                  while( true ) {
                                                    if (lVar8 + 0x20 == 0x80) break;
                                                    puVar7 = (uchar *)((long)args + lVar8);
                                                    testrand256(puVar7);
                                                    iVar4 = secp256k1_schnorrsig_sign32
                                                                      (CTX,(uchar *)sig64,puVar7,
                                                                       (secp256k1_keypair *)nonce,
                                                                       (uchar *)0x0);
                                                    if (iVar4 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig[i], msg[i], &keypair, NULL)"
                                                  ;
                                                  uVar14 = 0x366;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)sig64,puVar7,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  lVar8 = lVar8 + 0x20;
                                                  sig64 = (secp256k1_sha256 *)(sig64->buf + 0x20);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[i], msg[i], sizeof(msg[i]), &pk)"
                                                  ;
                                                  uVar14 = 0x367;
                                                  goto LAB_00128441;
                                                  }
                                                  }
                                                  uVar3 = testrand_int(3);
                                                  uVar6 = testrand64();
                                                  uVar5 = testrand_int(0xfe);
                                                  sig64_00 = sha_optimized.s + (ulong)uVar3 * 0x10;
                                                  bVar9 = (char)uVar5 + 1;
                                                  pbVar11 = (byte *)((long)sig64_00 +
                                                                    (uVar6 >> 0x3b));
                                                  *pbVar11 = *pbVar11 ^ bVar9;
                                                  msg_00 = args + (ulong)uVar3 * 4;
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)sig64_00,
                                                                     (uchar *)msg_00,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
                                                  ;
                                                  uVar14 = 0x371;
                                                  goto LAB_00128441;
                                                  }
                                                  pbVar11 = (byte *)((long)sig64_00 +
                                                                    (uVar6 >> 0x3b));
                                                  *pbVar11 = *pbVar11 ^ bVar9;
                                                  uVar6 = testrand64();
                                                  pbVar11 = (byte *)((long)sig64_00 +
                                                                    (uVar6 >> 0x3b) + 0x20);
                                                  *pbVar11 = *pbVar11 ^ bVar9;
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)sig64_00,
                                                                     (uchar *)msg_00,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
                                                  ;
                                                  uVar14 = 0x376;
                                                  goto LAB_00128441;
                                                  }
                                                  pbVar11 = (byte *)((long)sig64_00 +
                                                                    (uVar6 >> 0x3b) + 0x20);
                                                  *pbVar11 = *pbVar11 ^ bVar9;
                                                  uVar6 = testrand64();
                                                  pbVar11 = (byte *)((long)msg_00 + (uVar6 >> 0x3b))
                                                  ;
                                                  *pbVar11 = *pbVar11 ^ bVar9;
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)sig64_00,
                                                                     (uchar *)msg_00,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
                                                  ;
                                                  uVar14 = 0x37b;
                                                  goto LAB_00128441;
                                                  }
                                                  pbVar11 = (byte *)((long)msg_00 + (uVar6 >> 0x3b))
                                                  ;
                                                  *pbVar11 = *pbVar11 ^ bVar9;
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)sig64_00,
                                                                     (uchar *)msg_00,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[sig_idx], msg[sig_idx], sizeof(msg[sig_idx]), &pk)"
                                                  ;
                                                  uVar14 = 0x37f;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign32
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)args,
                                                                     (secp256k1_keypair *)nonce,
                                                                     (uchar *)0x0);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig[0], msg[0], &keypair, NULL)"
                                                  ;
                                                  uVar14 = 899;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)args,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
                                                  ;
                                                  uVar14 = 900;
                                                  goto LAB_00128441;
                                                  }
                                                  sha_optimized.buf[0x10] = 0xff;
                                                  sha_optimized.buf[0x11] = 0xff;
                                                  sha_optimized.buf[0x12] = 0xff;
                                                  sha_optimized.buf[0x13] = 0xff;
                                                  sha_optimized.buf[0x14] = 0xff;
                                                  sha_optimized.buf[0x15] = 0xff;
                                                  sha_optimized.buf[0x16] = 0xff;
                                                  sha_optimized.buf[0x17] = 0xff;
                                                  sha_optimized.buf[0x18] = 0xff;
                                                  sha_optimized.buf[0x19] = 0xff;
                                                  sha_optimized.buf[0x1a] = 0xff;
                                                  sha_optimized.buf[0x1b] = 0xff;
                                                  sha_optimized.buf[0x1c] = 0xff;
                                                  sha_optimized.buf[0x1d] = 0xff;
                                                  sha_optimized.buf[0x1e] = 0xff;
                                                  sha_optimized.buf[0x1f] = 0xff;
                                                  sha_optimized.buf[0] = 0xff;
                                                  sha_optimized.buf[1] = 0xff;
                                                  sha_optimized.buf[2] = 0xff;
                                                  sha_optimized.buf[3] = 0xff;
                                                  sha_optimized.buf[4] = 0xff;
                                                  sha_optimized.buf[5] = 0xff;
                                                  sha_optimized.buf[6] = 0xff;
                                                  sha_optimized.buf[7] = 0xff;
                                                  sha_optimized.buf[8] = 0xff;
                                                  sha_optimized.buf[9] = 0xff;
                                                  sha_optimized.buf[10] = 0xff;
                                                  sha_optimized.buf[0xb] = 0xff;
                                                  sha_optimized.buf[0xc] = 0xff;
                                                  sha_optimized.buf[0xd] = 0xff;
                                                  sha_optimized.buf[0xe] = 0xff;
                                                  sha_optimized.buf[0xf] = 0xff;
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)args,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
                                                  ;
                                                  uVar14 = 0x386;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign32
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)args,
                                                                     (secp256k1_keypair *)nonce,
                                                                     (uchar *)0x0);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig[0], msg[0], &keypair, NULL)"
                                                  ;
                                                  uVar14 = 0x389;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)args,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
                                                  ;
                                                  uVar14 = 0x38a;
                                                  goto LAB_00128441;
                                                  }
                                                  secp256k1_scalar_set_b32
                                                            ((secp256k1_scalar *)key,
                                                             sha_optimized.buf,(int *)0x0);
                                                  secp256k1_scalar_negate
                                                            ((secp256k1_scalar *)key,
                                                             (secp256k1_scalar *)key);
                                                  secp256k1_scalar_get_b32
                                                            (sha_optimized.buf,
                                                             (secp256k1_scalar *)key);
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)args,0x20,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_schnorrsig_verify(CTX, sig[0], msg[0], sizeof(msg[0]), &pk)"
                                                  ;
                                                  uVar14 = 0x38e;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)0x0,0,
                                                                     (secp256k1_keypair *)nonce,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)0x0);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig[0], NULL, 0, &keypair, NULL) == 1"
                                                  ;
                                                  uVar14 = 0x391;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)0x0,0,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], NULL, 0, &pk) == 1"
                                                  ;
                                                  uVar14 = 0x392;
                                                  goto LAB_00128441;
                                                  }
                                                  uVar3 = testrand_int(0x100);
                                                  for (uVar13 = 0; uVar13 < 0x100;
                                                      uVar13 = uVar13 + 0x20) {
                                                    testrand256((uchar *)((long)sha.s + uVar13));
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_sign_custom
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)&sha,(ulong)uVar3,
                                                                     (secp256k1_keypair *)nonce,
                                                                     (
                                                  secp256k1_schnorrsig_extraparams *)0x0);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign_custom(CTX, sig[0], msg_large, msglen, &keypair, NULL) == 1"
                                                  ;
                                                  uVar14 = 0x39b;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)&sha,(ulong)uVar3,
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg_large, msglen, &pk) == 1"
                                                  ;
                                                  uVar14 = 0x39c;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar4 = secp256k1_schnorrsig_verify
                                                                    (CTX,(uchar *)&sha_optimized,
                                                                     (uchar *)&sha,
                                                                     (ulong)(uVar3 - 1 & 0xff),
                                                                     (secp256k1_xonly_pubkey *)
                                                                     nonce_z);
                                                  if (iVar4 != 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig[0], msg_large, msglen, &pk) == 0"
                                                  ;
                                                  uVar14 = 0x39f;
                                                  goto LAB_00128441;
                                                  }
                                                  iVar12 = iVar12 + 1;
                                                  }
                                                  testrand256(nonce_z);
                                                  iVar12 = secp256k1_keypair_create
                                                                     (CTX,(secp256k1_keypair *)&sha,
                                                                      nonce_z);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_create(CTX, &keypair, sk) == 1"
                                                  ;
                                                  uVar14 = 0x3b2;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_keypair_xonly_pub
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&sha_optimized,
                                                                        (int *)0x0,
                                                                        (secp256k1_keypair *)&sha);
                                                    if (iVar12 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &internal_pk, NULL, &keypair) == 1"
                                                  ;
                                                  uVar14 = 0x3b3;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,pk,(
                                                  secp256k1_xonly_pubkey *)&sha_optimized);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, tweak, &internal_pk) == 1"
                                                  ;
                                                  uVar14 = 0x3b5;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_keypair_xonly_tweak_add
                                                                       (CTX,(secp256k1_keypair *)
                                                                            &sha,pk);
                                                    if (iVar12 == 1) {
                                                      iVar12 = secp256k1_keypair_xonly_pub
                                                                         (CTX,(
                                                  secp256k1_xonly_pubkey *)args,(int *)algo,
                                                  (secp256k1_keypair *)&sha);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_xonly_pub(CTX, &output_pk, &pk_parity, &keypair) == 1"
                                                  ;
                                                  uVar14 = 0x3b7;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,key,(
                                                  secp256k1_xonly_pubkey *)args);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, output_pk_bytes, &output_pk) == 1"
                                                  ;
                                                  uVar14 = 0x3b8;
                                                  }
                                                  else {
                                                    testrand256(aux_rand);
                                                    iVar12 = secp256k1_schnorrsig_sign32
                                                                       (CTX,nonce,aux_rand,
                                                                        (secp256k1_keypair *)&sha,
                                                                        (uchar *)0x0);
                                                    if (iVar12 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, NULL) == 1"
                                                  ;
                                                  uVar14 = 0x3bc;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)args,key);
                                                    if (iVar12 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &output_pk, output_pk_bytes) == 1"
                                                  ;
                                                  uVar14 = 0x3be;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_schnorrsig_verify
                                                                       (CTX,nonce,aux_rand,0x20,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        args);
                                                    if (iVar12 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &output_pk) == 1"
                                                  ;
                                                  uVar14 = 0x3bf;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_serialize
                                                                       (CTX,msg,(
                                                  secp256k1_xonly_pubkey *)&sha_optimized);
                                                  if (iVar12 == 0) {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, internal_pk_bytes, &internal_pk) == 1"
                                                  ;
                                                  uVar14 = 0x3c2;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_parse
                                                                       (CTX,(secp256k1_xonly_pubkey
                                                                             *)&sha_optimized,msg);
                                                    if (iVar12 == 0) {
                                                      pcVar10 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_parse(CTX, &internal_pk, internal_pk_bytes) == 1"
                                                  ;
                                                  uVar14 = 0x3c4;
                                                  }
                                                  else {
                                                    iVar12 = secp256k1_xonly_pubkey_tweak_add_check
                                                                       (CTX,key,algo._0_4_,
                                                                        (secp256k1_xonly_pubkey *)
                                                                        &sha_optimized,pk);
                                                    if (iVar12 != 0) {
                                                      return;
                                                    }
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, output_pk_bytes, pk_parity, &internal_pk, tweak) == 1"
                                                  ;
                                                  uVar14 = 0x3c5;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_keypair_xonly_tweak_add(CTX, &keypair, tweak) == 1"
                                                  ;
                                                  uVar14 = 0x3b6;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_xonly_pubkey_parse(CTX, &pk_parsed, pk)"
                                                  ;
                                                  uVar14 = 0x26b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: !secp256k1_xonly_pubkey_parse(CTX, &pk_parsed, pk)"
                                                  ;
                                                  uVar14 = 399;
                                                  }
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), &zero_pk)) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x9b;
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_verify(CTX, sig, msg, sizeof(msg), ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x9a;
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: secp256k1_schnorrsig_verify(CTX, sig, NULL, 0, &pk[0]) == 0"
                                                  ;
                                                  uVar14 = 0x99;
                                                  }
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_verify(CTX, sig, ((void*)0), sizeof(msg), &pk[0])) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x98;
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_verify(CTX, ((void*)0), msg, sizeof(msg), &pk[0])) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x97;
                                                  }
                                                  }
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_sign_custom(STATIC_CTX, sig, msg, sizeof(msg), &keypairs[0], &extraparams)) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x93;
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &keypairs[0], &invalid_extraparams)) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x92;
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), &invalid_keypair, &extraparams)) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x90;
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_sign_custom(CTX, sig, msg, sizeof(msg), ((void*)0), &extraparams)) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x8f;
                                                  goto LAB_00128441;
                                                  }
                                                  pcVar10 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar10 = 
                                                  "test condition failed: (secp256k1_schnorrsig_sign_custom(CTX, sig, ((void*)0), sizeof(msg), &keypairs[0], &extraparams)) == 0"
                                                  ;
                                                  }
                                                  uVar14 = 0x8d;
                                                  goto LAB_00128441;
                                                }
                                                pcVar10 = 
                                                "test condition failed: _calls_to_callback == 1";
                                              }
                                              else {
                                                pcVar10 = 
                                                "test condition failed: (secp256k1_schnorrsig_sign_custom(CTX, ((void*)0), msg, sizeof(msg), &keypairs[0], &extraparams)) == 0"
                                                ;
                                              }
                                              uVar14 = 0x8c;
                                              goto LAB_00128441;
                                            }
                                            pcVar10 = 
                                            "test condition failed: _calls_to_callback == 1";
                                          }
                                          else {
                                            pcVar10 = 
                                            "test condition failed: (secp256k1_schnorrsig_sign32(STATIC_CTX, sig, msg, &keypairs[0], ((void*)0))) == 0"
                                            ;
                                          }
                                          uVar14 = 0x89;
                                          goto LAB_00128441;
                                        }
                                        pcVar10 = "test condition failed: _calls_to_callback == 1";
                                      }
                                      else {
                                        pcVar10 = 
                                        "test condition failed: (secp256k1_schnorrsig_sign32(CTX, sig, msg, &invalid_keypair, ((void*)0))) == 0"
                                        ;
                                      }
                                      uVar14 = 0x88;
                                      goto LAB_00128441;
                                    }
                                    pcVar10 = "test condition failed: _calls_to_callback == 1";
                                  }
                                  else {
                                    pcVar10 = 
                                    "test condition failed: (secp256k1_schnorrsig_sign32(CTX, sig, msg, ((void*)0), ((void*)0))) == 0"
                                    ;
                                  }
                                  uVar14 = 0x87;
                                  goto LAB_00128441;
                                }
                                pcVar10 = "test condition failed: _calls_to_callback == 1";
                              }
                              else {
                                pcVar10 = 
                                "test condition failed: (secp256k1_schnorrsig_sign32(CTX, sig, ((void*)0), &keypairs[0], ((void*)0))) == 0"
                                ;
                              }
                              uVar14 = 0x86;
                              goto LAB_00128441;
                            }
                            pcVar10 = "test condition failed: _calls_to_callback == 1";
                          }
                          else {
                            pcVar10 = 
                            "test condition failed: (secp256k1_schnorrsig_sign32(CTX, ((void*)0), msg, &keypairs[0], ((void*)0))) == 0"
                            ;
                          }
                          uVar14 = 0x85;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            pcVar10 = "test condition failed: secp256k1_memcmp_var(nonce_z, nonce, 32) == 0";
            uVar14 = 0x67;
          }
        }
      }
    }
  }
LAB_00128441:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/schnorrsig/tests_impl.h"
          ,uVar14,pcVar10);
  abort();
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}